

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [12];
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  long lVar65;
  byte bVar66;
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  bool bVar72;
  float fVar73;
  float fVar100;
  float fVar101;
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar74;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined8 uVar103;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar145;
  float fVar146;
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar147;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar148;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar149;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar182;
  float fVar183;
  vint4 ai_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar184;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar185;
  vint4 ai_1;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  float fVar202;
  vint4 ai;
  undefined1 auVar294 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar234;
  float fVar235;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar236;
  undefined1 auVar233 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar247 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar255;
  float fVar268;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar280;
  float fVar291;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar292;
  float fVar303;
  float fVar304;
  undefined1 auVar293 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar305;
  undefined1 auVar302 [64];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar322 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_558 [8];
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 auStack_3c8 [16];
  undefined1 local_3b8 [32];
  uint auStack_398 [4];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [32];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  uint uStack_1e8;
  float afStack_1e4 [7];
  RTCHitN local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar333 [32];
  
  PVar7 = prim[1];
  uVar63 = (ulong)(byte)PVar7;
  lVar65 = uVar63 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar73 = *(float *)(prim + lVar65 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar65 + 6));
  auVar75._0_4_ = fVar73 * auVar15._0_4_;
  auVar75._4_4_ = fVar73 * auVar15._4_4_;
  auVar75._8_4_ = fVar73 * auVar15._8_4_;
  auVar75._12_4_ = fVar73 * auVar15._12_4_;
  auVar286._0_4_ = fVar73 * auVar16._0_4_;
  auVar286._4_4_ = fVar73 * auVar16._4_4_;
  auVar286._8_4_ = fVar73 * auVar16._8_4_;
  auVar286._12_4_ = fVar73 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar63 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar317._4_4_ = auVar286._0_4_;
  auVar317._0_4_ = auVar286._0_4_;
  auVar317._8_4_ = auVar286._0_4_;
  auVar317._12_4_ = auVar286._0_4_;
  auVar22 = vshufps_avx(auVar286,auVar286,0x55);
  auVar23 = vshufps_avx(auVar286,auVar286,0xaa);
  fVar73 = auVar23._0_4_;
  auVar269._0_4_ = fVar73 * auVar89._0_4_;
  fVar100 = auVar23._4_4_;
  auVar269._4_4_ = fVar100 * auVar89._4_4_;
  fVar101 = auVar23._8_4_;
  auVar269._8_4_ = fVar101 * auVar89._8_4_;
  fVar149 = auVar23._12_4_;
  auVar269._12_4_ = fVar149 * auVar89._12_4_;
  auVar256._0_4_ = auVar170._0_4_ * fVar73;
  auVar256._4_4_ = auVar170._4_4_ * fVar100;
  auVar256._8_4_ = auVar170._8_4_ * fVar101;
  auVar256._12_4_ = auVar170._12_4_ * fVar149;
  auVar240._0_4_ = auVar21._0_4_ * fVar73;
  auVar240._4_4_ = auVar21._4_4_ * fVar100;
  auVar240._8_4_ = auVar21._8_4_ * fVar101;
  auVar240._12_4_ = auVar21._12_4_ * fVar149;
  auVar23 = vfmadd231ps_fma(auVar269,auVar22,auVar16);
  auVar32 = vfmadd231ps_fma(auVar256,auVar22,auVar19);
  auVar22 = vfmadd231ps_fma(auVar240,auVar168,auVar22);
  auVar77 = vfmadd231ps_fma(auVar23,auVar317,auVar15);
  auVar32 = vfmadd231ps_fma(auVar32,auVar317,auVar18);
  auVar294 = vfmadd231ps_fma(auVar22,auVar20,auVar317);
  auVar318._4_4_ = auVar75._0_4_;
  auVar318._0_4_ = auVar75._0_4_;
  auVar318._8_4_ = auVar75._0_4_;
  auVar318._12_4_ = auVar75._0_4_;
  auVar22 = vshufps_avx(auVar75,auVar75,0x55);
  auVar23 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar73 = auVar23._0_4_;
  auVar130._0_4_ = fVar73 * auVar89._0_4_;
  fVar100 = auVar23._4_4_;
  auVar130._4_4_ = fVar100 * auVar89._4_4_;
  fVar101 = auVar23._8_4_;
  auVar130._8_4_ = fVar101 * auVar89._8_4_;
  fVar149 = auVar23._12_4_;
  auVar130._12_4_ = fVar149 * auVar89._12_4_;
  auVar104._0_4_ = auVar170._0_4_ * fVar73;
  auVar104._4_4_ = auVar170._4_4_ * fVar100;
  auVar104._8_4_ = auVar170._8_4_ * fVar101;
  auVar104._12_4_ = auVar170._12_4_ * fVar149;
  auVar76._0_4_ = auVar21._0_4_ * fVar73;
  auVar76._4_4_ = auVar21._4_4_ * fVar100;
  auVar76._8_4_ = auVar21._8_4_ * fVar101;
  auVar76._12_4_ = auVar21._12_4_ * fVar149;
  auVar16 = vfmadd231ps_fma(auVar130,auVar22,auVar16);
  auVar89 = vfmadd231ps_fma(auVar104,auVar22,auVar19);
  auVar19 = vfmadd231ps_fma(auVar76,auVar22,auVar168);
  auVar104 = vfmadd231ps_fma(auVar16,auVar318,auVar15);
  auVar105 = vfmadd231ps_fma(auVar89,auVar318,auVar18);
  auVar328._8_4_ = 0x7fffffff;
  auVar328._0_8_ = 0x7fffffff7fffffff;
  auVar328._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar77,auVar328);
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar221,1);
  auVar16 = vblendvps_avx(auVar77,auVar221,auVar15);
  auVar15 = vandps_avx(auVar32,auVar328);
  auVar15 = vcmpps_avx(auVar15,auVar221,1);
  auVar89 = vblendvps_avx(auVar32,auVar221,auVar15);
  auVar15 = vandps_avx(auVar294,auVar328);
  auVar15 = vcmpps_avx(auVar15,auVar221,1);
  auVar15 = vblendvps_avx(auVar294,auVar221,auVar15);
  auVar106 = vfmadd231ps_fma(auVar19,auVar318,auVar20);
  auVar18 = vrcpps_avx(auVar16);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar222);
  auVar77 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar89);
  auVar89 = vfnmadd213ps_fma(auVar89,auVar16,auVar222);
  auVar294 = vfmadd132ps_fma(auVar89,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar222);
  auVar75 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  fVar73 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar65 + 0x16)) *
           *(float *)(prim + lVar65 + 0x1a);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar203._4_4_ = fVar73;
  auVar203._0_4_ = fVar73;
  auVar203._8_4_ = fVar73;
  auVar203._12_4_ = fVar73;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar76 = vfmadd213ps_fma(auVar16,auVar203,auVar15);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar89);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar89 = vfmadd213ps_fma(auVar16,auVar203,auVar15);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  uVar68 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar68 + 6);
  auVar16 = vpmovsxwd_avx(auVar170);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar18 = vfmadd213ps_fma(auVar16,auVar203,auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar168);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar19 = vfmadd213ps_fma(auVar16,auVar203,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar22);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar170 = vfmadd213ps_fma(auVar16,auVar203,auVar15);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar63) + 6);
  auVar15 = vpmovsxwd_avx(auVar23);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar32);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar16 = vfmadd213ps_fma(auVar16,auVar203,auVar15);
  auVar15 = vsubps_avx(auVar76,auVar104);
  auVar204._0_4_ = auVar77._0_4_ * auVar15._0_4_;
  auVar204._4_4_ = auVar77._4_4_ * auVar15._4_4_;
  auVar204._8_4_ = auVar77._8_4_ * auVar15._8_4_;
  auVar204._12_4_ = auVar77._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar89,auVar104);
  auVar131._0_4_ = auVar77._0_4_ * auVar15._0_4_;
  auVar131._4_4_ = auVar77._4_4_ * auVar15._4_4_;
  auVar131._8_4_ = auVar77._8_4_ * auVar15._8_4_;
  auVar131._12_4_ = auVar77._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar18,auVar105);
  auVar191._0_4_ = auVar294._0_4_ * auVar15._0_4_;
  auVar191._4_4_ = auVar294._4_4_ * auVar15._4_4_;
  auVar191._8_4_ = auVar294._8_4_ * auVar15._8_4_;
  auVar191._12_4_ = auVar294._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar19,auVar105);
  auVar105._0_4_ = auVar294._0_4_ * auVar15._0_4_;
  auVar105._4_4_ = auVar294._4_4_ * auVar15._4_4_;
  auVar105._8_4_ = auVar294._8_4_ * auVar15._8_4_;
  auVar105._12_4_ = auVar294._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar170,auVar106);
  auVar166._0_4_ = auVar75._0_4_ * auVar15._0_4_;
  auVar166._4_4_ = auVar75._4_4_ * auVar15._4_4_;
  auVar166._8_4_ = auVar75._8_4_ * auVar15._8_4_;
  auVar166._12_4_ = auVar75._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar16,auVar106);
  auVar77._0_4_ = auVar75._0_4_ * auVar15._0_4_;
  auVar77._4_4_ = auVar75._4_4_ * auVar15._4_4_;
  auVar77._8_4_ = auVar75._8_4_ * auVar15._8_4_;
  auVar77._12_4_ = auVar75._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar204,auVar131);
  auVar16 = vpminsd_avx(auVar191,auVar105);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar166,auVar77);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar241._4_4_ = uVar74;
  auVar241._0_4_ = uVar74;
  auVar241._8_4_ = uVar74;
  auVar241._12_4_ = uVar74;
  auVar16 = vmaxps_avx(auVar16,auVar241);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_2d8._0_4_ = auVar15._0_4_ * 0.99999964;
  local_2d8._4_4_ = auVar15._4_4_ * 0.99999964;
  local_2d8._8_4_ = auVar15._8_4_ * 0.99999964;
  local_2d8._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar204,auVar131);
  auVar16 = vpmaxsd_avx(auVar191,auVar105);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar166,auVar77);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = uVar74;
  auVar157._0_4_ = uVar74;
  auVar157._8_4_ = uVar74;
  auVar157._12_4_ = uVar74;
  auVar16 = vminps_avx(auVar16,auVar157);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar294._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar294._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar294._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar294._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar106._1_3_ = 0;
  auVar106[0] = PVar7;
  auVar106[4] = PVar7;
  auVar106._5_3_ = 0;
  auVar106[8] = PVar7;
  auVar106._9_3_ = 0;
  auVar106[0xc] = PVar7;
  auVar106._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar106,_DAT_01f7fcf0);
  auVar15 = vcmpps_avx(local_2d8,auVar294,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar61 = vmovmskps_avx(auVar15);
  if (uVar61 == 0) {
    uVar63 = 0;
LAB_016de214:
    return (bool)((byte)uVar63 & 1);
  }
  uVar61 = uVar61 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_138 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar335 = ZEXT864(0);
  local_450 = prim;
LAB_016dc02a:
  lVar65 = 0;
  for (uVar63 = (ulong)uVar61; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar65 = lVar65 + 1;
  }
  uVar62 = *(uint *)(local_450 + 2);
  local_2f8 = *(uint *)(local_450 + lVar65 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar62].ptr;
  fVar73 = (pGVar8->time_range).lower;
  fVar101 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar73) / ((pGVar8->time_range).upper - fVar73));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar22 = vmaxss_avx(auVar335._0_16_,auVar15);
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)local_2f8 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar22._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar71);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar71);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar63);
  lVar65 = uVar63 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar65);
  lVar1 = uVar63 + 2;
  auVar89 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar63 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  auVar203 = *pauVar3;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar71);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar71);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar63);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar65);
  auVar170 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar73 = *pfVar4;
  fVar100 = pfVar4[1];
  fVar149 = pfVar4[2];
  fVar185 = pfVar4[3];
  auVar286 = ZEXT816(0) << 0x40;
  auVar281._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar281._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar281._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar281._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar150._8_4_ = 0x3e2aaaab;
  auVar150._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar150._12_4_ = 0x3e2aaaab;
  auVar77 = vfmadd213ps_fma(auVar150,auVar89,auVar281);
  auVar319._8_4_ = 0x3f000000;
  auVar319._0_8_ = 0x3f0000003f000000;
  auVar319._12_4_ = 0x3f000000;
  auVar20 = vfmadd231ps_fma(auVar281,auVar89,auVar319);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar16,auVar286);
  auVar131 = vfnmadd231ps_fma(auVar20,auVar15,auVar319);
  auVar186._0_4_ = fVar73 * 0.0;
  auVar186._4_4_ = fVar100 * 0.0;
  auVar186._8_4_ = fVar149 * 0.0;
  auVar186._12_4_ = fVar185 * 0.0;
  auVar20 = vfmadd213ps_fma(auVar150,auVar170,auVar186);
  auVar151._8_4_ = 0x3f2aaaab;
  auVar151._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar151._12_4_ = 0x3f2aaaab;
  auVar20 = vfmadd231ps_fma(auVar20,auVar19,auVar151);
  auVar20 = vfmadd231ps_fma(auVar20,auVar18,auVar150);
  auVar168 = vfmadd231ps_fma(auVar186,auVar170,auVar319);
  auVar168 = vfnmadd231ps_fma(auVar168,auVar19,auVar286);
  auVar21 = vfnmadd231ps_fma(auVar168,auVar18,auVar319);
  auVar293._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar293._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar293._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar293._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar168 = vfmadd231ps_fma(auVar293,auVar286,auVar89);
  auVar168 = vfnmadd231ps_fma(auVar168,auVar319,auVar16);
  auVar157 = vfnmadd231ps_fma(auVar168,auVar286,auVar15);
  auVar242._0_4_ = fVar73 * 0.16666667;
  auVar242._4_4_ = fVar100 * 0.16666667;
  auVar242._8_4_ = fVar149 * 0.16666667;
  auVar242._12_4_ = fVar185 * 0.16666667;
  auVar168 = vfmadd231ps_fma(auVar242,auVar170,auVar151);
  auVar168 = vfmadd231ps_fma(auVar168,auVar19,auVar150);
  auVar168 = vfmadd231ps_fma(auVar168,auVar18,auVar286);
  auVar205._0_4_ = fVar73 * 0.5;
  auVar205._4_4_ = fVar100 * 0.5;
  auVar205._8_4_ = fVar149 * 0.5;
  auVar205._12_4_ = fVar185 * 0.5;
  auVar170 = vfmadd231ps_fma(auVar205,auVar286,auVar170);
  auVar19 = vfnmadd231ps_fma(auVar170,auVar319,auVar19);
  auVar170 = vfnmadd231ps_fma(auVar19,auVar286,auVar18);
  auVar18 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar268 = auVar131._0_4_;
  auVar107._0_4_ = fVar268 * auVar19._0_4_;
  fVar280 = auVar131._4_4_;
  auVar107._4_4_ = fVar280 * auVar19._4_4_;
  fVar291 = auVar131._8_4_;
  auVar107._8_4_ = fVar291 * auVar19._8_4_;
  fVar102 = auVar131._12_4_;
  auVar107._12_4_ = fVar102 * auVar19._12_4_;
  auVar75 = vfmsub231ps_fma(auVar107,auVar18,auVar20);
  auVar19 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar108._0_4_ = fVar268 * auVar19._0_4_;
  auVar108._4_4_ = fVar280 * auVar19._4_4_;
  auVar108._8_4_ = fVar291 * auVar19._8_4_;
  auVar108._12_4_ = fVar102 * auVar19._12_4_;
  auVar76 = vfmsub231ps_fma(auVar108,auVar18,auVar21);
  auVar18 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar19 = vshufps_avx(auVar168,auVar168,0xc9);
  fVar292 = auVar157._0_4_;
  auVar109._0_4_ = fVar292 * auVar19._0_4_;
  fVar303 = auVar157._4_4_;
  auVar109._4_4_ = fVar303 * auVar19._4_4_;
  fVar304 = auVar157._8_4_;
  auVar109._8_4_ = fVar304 * auVar19._8_4_;
  fVar305 = auVar157._12_4_;
  auVar109._12_4_ = fVar305 * auVar19._12_4_;
  auVar104 = vfmsub231ps_fma(auVar109,auVar18,auVar168);
  auVar19 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar110._0_4_ = fVar292 * auVar19._0_4_;
  auVar110._4_4_ = fVar303 * auVar19._4_4_;
  auVar110._8_4_ = fVar304 * auVar19._8_4_;
  auVar110._12_4_ = fVar305 * auVar19._12_4_;
  auVar105 = vfmsub231ps_fma(auVar110,auVar18,auVar170);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar71);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar71);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar60 = *pauVar5;
  fVar148 = *(float *)pauVar5[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar71);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar71);
  auVar257._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar257._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar257._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar257._12_4_ = fVar148 * 0.0;
  auVar294 = vfmadd213ps_fma(auVar150,auVar18,auVar257);
  auVar170 = vfmadd231ps_fma(auVar257,auVar18,auVar319);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar65);
  auVar20 = vfnmadd231ps_fma(auVar170,auVar19,auVar286);
  auVar170 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar63);
  auVar166 = vfnmadd231ps_fma(auVar20,auVar170,auVar319);
  auVar20 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar73 = *pfVar4;
  fVar100 = pfVar4[1];
  fVar149 = pfVar4[2];
  fVar185 = pfVar4[3];
  auVar78._0_4_ = fVar73 * 0.0;
  auVar78._4_4_ = fVar100 * 0.0;
  auVar78._8_4_ = fVar149 * 0.0;
  auVar78._12_4_ = fVar185 * 0.0;
  auVar21 = vfmadd213ps_fma(auVar150,auVar20,auVar78);
  auVar168 = *(undefined1 (*) [16])(lVar13 + lVar65 * lVar10);
  auVar111._8_4_ = 0x3f2aaaab;
  auVar111._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar111._12_4_ = 0x3f2aaaab;
  auVar23 = vfmadd231ps_fma(auVar21,auVar168,auVar111);
  auVar21 = *(undefined1 (*) [16])(lVar13 + uVar63 * lVar10);
  auVar32 = vfmadd231ps_fma(auVar23,auVar21,auVar150);
  auVar23 = vshufps_avx(auVar32,auVar32,0xc9);
  fVar237 = auVar166._0_4_;
  auVar187._0_4_ = fVar237 * auVar23._0_4_;
  fVar238 = auVar166._4_4_;
  auVar187._4_4_ = fVar238 * auVar23._4_4_;
  fVar239 = auVar166._8_4_;
  auVar187._8_4_ = fVar239 * auVar23._8_4_;
  fVar255 = auVar166._12_4_;
  auVar187._12_4_ = fVar255 * auVar23._12_4_;
  auVar23 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar106 = vfmsub231ps_fma(auVar187,auVar23,auVar32);
  auVar32 = vfmadd231ps_fma(auVar78,auVar20,auVar319);
  auVar32 = vfnmadd231ps_fma(auVar32,auVar168,auVar286);
  auVar286 = vfnmadd231ps_fma(auVar32,auVar21,auVar319);
  auVar32 = vshufps_avx(auVar286,auVar286,0xc9);
  auVar223._0_4_ = fVar237 * auVar32._0_4_;
  auVar223._4_4_ = fVar238 * auVar32._4_4_;
  auVar223._8_4_ = fVar239 * auVar32._8_4_;
  auVar223._12_4_ = fVar255 * auVar32._12_4_;
  auVar32 = vfmsub231ps_fma(auVar223,auVar23,auVar286);
  auVar79._0_4_ = fVar73 * 0.16666667;
  auVar79._4_4_ = fVar100 * 0.16666667;
  auVar79._8_4_ = fVar149 * 0.16666667;
  auVar79._12_4_ = fVar185 * 0.16666667;
  auVar167._8_4_ = 0x3f2aaaab;
  auVar167._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar167._12_4_ = 0x3f2aaaab;
  auVar23 = vfmadd231ps_fma(auVar79,auVar20,auVar167);
  auVar152._0_4_ = fVar73 * 0.5;
  auVar152._4_4_ = fVar100 * 0.5;
  auVar152._8_4_ = fVar149 * 0.5;
  auVar152._12_4_ = fVar185 * 0.5;
  auVar286 = ZEXT816(0) << 0x20;
  auVar20 = vfmadd231ps_fma(auVar152,auVar286,auVar20);
  auVar23 = vfmadd231ps_fma(auVar23,auVar168,auVar150);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar319,auVar168);
  auVar168 = vfmadd231ps_fma(auVar23,auVar21,auVar286);
  auVar21 = vfnmadd231ps_fma(auVar20,auVar286,auVar21);
  local_618 = auVar60._0_4_;
  fStack_614 = auVar60._4_4_;
  fStack_610 = auVar60._8_4_;
  auVar206._0_4_ = local_618 * 0.5;
  auVar206._4_4_ = fStack_614 * 0.5;
  auVar206._8_4_ = fStack_610 * 0.5;
  auVar206._12_4_ = fVar148 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar206,auVar286,auVar18);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar319,auVar19);
  auVar191 = vfnmadd231ps_fma(auVar20,auVar286,auVar170);
  auVar20 = vshufps_avx(auVar168,auVar168,0xc9);
  fVar202 = auVar191._0_4_;
  auVar112._0_4_ = fVar202 * auVar20._0_4_;
  fVar234 = auVar191._4_4_;
  auVar112._4_4_ = fVar234 * auVar20._4_4_;
  fVar235 = auVar191._8_4_;
  auVar112._8_4_ = fVar235 * auVar20._8_4_;
  fVar236 = auVar191._12_4_;
  auVar112._12_4_ = fVar236 * auVar20._12_4_;
  auVar20 = vshufps_avx(auVar191,auVar191,0xc9);
  auVar286 = vfmsub231ps_fma(auVar112,auVar20,auVar168);
  auVar168 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar80._0_4_ = fVar202 * auVar168._0_4_;
  auVar80._4_4_ = fVar234 * auVar168._4_4_;
  auVar80._8_4_ = fVar235 * auVar168._8_4_;
  auVar80._12_4_ = fVar236 * auVar168._12_4_;
  auVar130 = vfmsub231ps_fma(auVar80,auVar20,auVar21);
  fVar101 = fVar101 - auVar22._0_4_;
  local_3d8._0_4_ = auVar203._0_4_;
  local_3d8._4_4_ = auVar203._4_4_;
  fStack_3d0 = auVar203._8_4_;
  fStack_3cc = auVar203._12_4_;
  auVar113._0_4_ = (float)local_3d8._0_4_ * 0.16666667;
  auVar113._4_4_ = (float)local_3d8._4_4_ * 0.16666667;
  auVar113._8_4_ = fStack_3d0 * 0.16666667;
  auVar113._12_4_ = fStack_3cc * 0.16666667;
  auVar89 = vfmadd231ps_fma(auVar113,auVar167,auVar89);
  auVar20 = vfmadd231ps_fma(auVar77,auVar16,auVar167);
  auVar16 = vfmadd231ps_fma(auVar89,auVar16,auVar150);
  auVar22 = vfmadd231ps_fma(auVar20,auVar15,auVar150);
  auVar23 = vfmadd231ps_fma(auVar16,auVar15,ZEXT816(0));
  auVar89 = vpermilps_avx(auVar75,0xc9);
  auVar15 = vdpps_avx(auVar89,auVar89,0x7f);
  fVar100 = auVar15._0_4_;
  auVar168 = ZEXT416((uint)fVar100);
  auVar16 = vrsqrtss_avx(auVar168,auVar168);
  fVar73 = auVar16._0_4_;
  auVar20 = vpermilps_avx(auVar76,0xc9);
  auVar16 = vdpps_avx(auVar89,auVar20,0x7f);
  fVar73 = fVar100 * -0.5 * fVar73 * fVar73 * fVar73 + fVar73 * 1.5;
  auVar243._0_4_ = fVar100 * auVar20._0_4_;
  auVar243._4_4_ = fVar100 * auVar20._4_4_;
  auVar243._8_4_ = fVar100 * auVar20._8_4_;
  auVar243._12_4_ = fVar100 * auVar20._12_4_;
  fVar100 = auVar16._0_4_;
  auVar188._0_4_ = fVar100 * auVar89._0_4_;
  auVar188._4_4_ = fVar100 * auVar89._4_4_;
  auVar188._8_4_ = fVar100 * auVar89._8_4_;
  auVar188._12_4_ = fVar100 * auVar89._12_4_;
  auVar20 = vsubps_avx(auVar243,auVar188);
  auVar16 = vrcpss_avx(auVar168,auVar168);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar149 = auVar16._0_4_ * auVar15._0_4_;
  auVar168 = vpermilps_avx(auVar104,0xc9);
  auVar16 = vdpps_avx(auVar168,auVar168,0x7f);
  fVar129 = auVar89._0_4_ * fVar73;
  fVar145 = auVar89._4_4_ * fVar73;
  fVar146 = auVar89._8_4_ * fVar73;
  fVar147 = auVar89._12_4_ * fVar73;
  auVar15 = vblendps_avx(auVar16,_DAT_01f7aa10,0xe);
  auVar89 = vrsqrtss_avx(auVar15,auVar15);
  fVar185 = auVar16._0_4_;
  fVar100 = auVar89._0_4_;
  fVar100 = fVar100 * 1.5 + fVar185 * -0.5 * fVar100 * fVar100 * fVar100;
  auVar21 = vpermilps_avx(auVar105,0xc9);
  auVar89 = vdpps_avx(auVar168,auVar21,0x7f);
  auVar224._0_4_ = auVar21._0_4_ * fVar185;
  auVar224._4_4_ = auVar21._4_4_ * fVar185;
  auVar224._8_4_ = auVar21._8_4_ * fVar185;
  auVar224._12_4_ = auVar21._12_4_ * fVar185;
  fVar185 = auVar89._0_4_;
  auVar306._0_4_ = fVar185 * auVar168._0_4_;
  auVar306._4_4_ = fVar185 * auVar168._4_4_;
  auVar306._8_4_ = fVar185 * auVar168._8_4_;
  auVar306._12_4_ = fVar185 * auVar168._12_4_;
  auVar89 = vsubps_avx(auVar224,auVar306);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,ZEXT416(0x40000000));
  fVar185 = auVar15._0_4_ * auVar16._0_4_;
  fVar165 = auVar168._0_4_ * fVar100;
  fVar182 = auVar168._4_4_ * fVar100;
  fVar183 = auVar168._8_4_ * fVar100;
  fVar184 = auVar168._12_4_ * fVar100;
  auVar15 = vshufps_avx(auVar131,auVar131,0xff);
  auVar16 = vshufps_avx(auVar22,auVar22,0xff);
  auVar244._0_4_ = auVar16._0_4_ * fVar129;
  auVar244._4_4_ = auVar16._4_4_ * fVar145;
  auVar244._8_4_ = auVar16._8_4_ * fVar146;
  auVar244._12_4_ = auVar16._12_4_ * fVar147;
  auVar81._0_4_ = auVar15._0_4_ * fVar129 + auVar16._0_4_ * fVar73 * fVar149 * auVar20._0_4_;
  auVar81._4_4_ = auVar15._4_4_ * fVar145 + auVar16._4_4_ * fVar73 * fVar149 * auVar20._4_4_;
  auVar81._8_4_ = auVar15._8_4_ * fVar146 + auVar16._8_4_ * fVar73 * fVar149 * auVar20._8_4_;
  auVar81._12_4_ = auVar15._12_4_ * fVar147 + auVar16._12_4_ * fVar73 * fVar149 * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar22,auVar244);
  local_628._0_4_ = auVar22._0_4_ + auVar244._0_4_;
  local_628._4_4_ = auVar22._4_4_ + auVar244._4_4_;
  fStack_620 = auVar22._8_4_ + auVar244._8_4_;
  fStack_61c = auVar22._12_4_ + auVar244._12_4_;
  auVar168 = vsubps_avx(auVar131,auVar81);
  auVar15 = vshufps_avx(auVar157,auVar157,0xff);
  auVar16 = vshufps_avx(auVar23,auVar23,0xff);
  auVar169._0_4_ = auVar16._0_4_ * fVar165;
  auVar169._4_4_ = auVar16._4_4_ * fVar182;
  auVar169._8_4_ = auVar16._8_4_ * fVar183;
  auVar169._12_4_ = auVar16._12_4_ * fVar184;
  auVar153._0_4_ = auVar15._0_4_ * fVar165 + auVar16._0_4_ * fVar100 * auVar89._0_4_ * fVar185;
  auVar153._4_4_ = auVar15._4_4_ * fVar182 + auVar16._4_4_ * fVar100 * auVar89._4_4_ * fVar185;
  auVar153._8_4_ = auVar15._8_4_ * fVar183 + auVar16._8_4_ * fVar100 * auVar89._8_4_ * fVar185;
  auVar153._12_4_ = auVar15._12_4_ * fVar184 + auVar16._12_4_ * fVar100 * auVar89._12_4_ * fVar185;
  auVar89 = vsubps_avx(auVar23,auVar169);
  local_5a8._4_4_ = auVar23._4_4_ + auVar169._4_4_;
  local_5a8._0_4_ = auVar23._0_4_ + auVar169._0_4_;
  fStack_5a0 = auVar23._8_4_ + auVar169._8_4_;
  fStack_59c = auVar23._12_4_ + auVar169._12_4_;
  auVar21 = vsubps_avx(auVar157,auVar153);
  auVar82._8_4_ = 0x3e2aaaab;
  auVar82._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar82._12_4_ = 0x3e2aaaab;
  auVar307._0_4_ = local_618 * 0.16666667;
  auVar307._4_4_ = fStack_614 * 0.16666667;
  auVar307._8_4_ = fStack_610 * 0.16666667;
  auVar307._12_4_ = fVar148 * 0.16666667;
  auVar132._8_4_ = 0x3f2aaaab;
  auVar132._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar132._12_4_ = 0x3f2aaaab;
  auVar15 = vfmadd231ps_fma(auVar307,auVar132,auVar18);
  auVar16 = vfmadd231ps_fma(auVar294,auVar19,auVar132);
  auVar15 = vfmadd231ps_fma(auVar15,auVar19,auVar82);
  auVar22 = vfmadd231ps_fma(auVar16,auVar170,auVar82);
  auVar23 = vfmadd231ps_fma(auVar15,auVar170,ZEXT816(0) << 0x20);
  auVar19 = vpermilps_avx(auVar106,0xc9);
  auVar15 = vdpps_avx(auVar19,auVar19,0x7f);
  fVar100 = auVar15._0_4_;
  auVar170 = ZEXT416((uint)fVar100);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar16 = vrsqrtss_avx(auVar170,auVar170);
  fVar73 = auVar16._0_4_;
  auVar18 = vpermilps_avx(auVar32,0xc9);
  auVar16 = vdpps_avx(auVar19,auVar18,0x7f);
  fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar100 * -0.5 * fVar73;
  auVar225._0_4_ = auVar18._0_4_ * fVar100;
  auVar225._4_4_ = auVar18._4_4_ * fVar100;
  auVar225._8_4_ = auVar18._8_4_ * fVar100;
  auVar225._12_4_ = auVar18._12_4_ * fVar100;
  fVar100 = auVar16._0_4_;
  auVar245._0_4_ = fVar100 * auVar19._0_4_;
  auVar245._4_4_ = fVar100 * auVar19._4_4_;
  auVar245._8_4_ = fVar100 * auVar19._8_4_;
  auVar245._12_4_ = fVar100 * auVar19._12_4_;
  auVar18 = vsubps_avx(auVar225,auVar245);
  auVar16 = vrcpss_avx(auVar170,auVar170);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar149 = auVar16._0_4_ * auVar15._0_4_;
  auVar170 = vpermilps_avx(auVar286,0xc9);
  auVar15 = vdpps_avx(auVar170,auVar170,0x7f);
  fVar148 = auVar19._0_4_ * fVar73;
  fVar129 = auVar19._4_4_ * fVar73;
  fVar145 = auVar19._8_4_ * fVar73;
  fVar146 = auVar19._12_4_ * fVar73;
  fVar185 = auVar15._0_4_;
  auVar171._4_12_ = SUB1612(auVar55 << 0x40,4);
  auVar171._0_4_ = fVar185;
  auVar16 = vrsqrtss_avx(auVar171,auVar171);
  fVar100 = auVar16._0_4_;
  fVar100 = fVar185 * -0.5 * fVar100 * fVar100 * fVar100 + fVar100 * 1.5;
  auVar19 = vpermilps_avx(auVar130,0xc9);
  auVar16 = vdpps_avx(auVar170,auVar19,0x7f);
  auVar282._0_4_ = fVar185 * auVar19._0_4_;
  auVar282._4_4_ = fVar185 * auVar19._4_4_;
  auVar282._8_4_ = fVar185 * auVar19._8_4_;
  auVar282._12_4_ = fVar185 * auVar19._12_4_;
  fVar185 = auVar16._0_4_;
  auVar320._0_4_ = fVar185 * auVar170._0_4_;
  auVar320._4_4_ = fVar185 * auVar170._4_4_;
  auVar320._8_4_ = fVar185 * auVar170._8_4_;
  auVar320._12_4_ = fVar185 * auVar170._12_4_;
  auVar19 = vsubps_avx(auVar282,auVar320);
  auVar16 = vrcpss_avx(auVar171,auVar171);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar185 = auVar15._0_4_ * auVar16._0_4_;
  fVar147 = auVar170._0_4_ * fVar100;
  fVar165 = auVar170._4_4_ * fVar100;
  fVar182 = auVar170._8_4_ * fVar100;
  fVar183 = auVar170._12_4_ * fVar100;
  auVar15 = vshufps_avx(auVar166,auVar166,0xff);
  auVar16 = vshufps_avx(auVar22,auVar22,0xff);
  auVar154._0_4_ = auVar16._0_4_ * fVar148;
  auVar154._4_4_ = auVar16._4_4_ * fVar129;
  auVar154._8_4_ = auVar16._8_4_ * fVar145;
  auVar154._12_4_ = auVar16._12_4_ * fVar146;
  auVar114._0_4_ = auVar15._0_4_ * fVar148 + auVar16._0_4_ * fVar73 * fVar149 * auVar18._0_4_;
  auVar114._4_4_ = auVar15._4_4_ * fVar129 + auVar16._4_4_ * fVar73 * fVar149 * auVar18._4_4_;
  auVar114._8_4_ = auVar15._8_4_ * fVar145 + auVar16._8_4_ * fVar73 * fVar149 * auVar18._8_4_;
  auVar114._12_4_ = auVar15._12_4_ * fVar146 + auVar16._12_4_ * fVar73 * fVar149 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar22,auVar154);
  fVar149 = auVar22._0_4_ + auVar154._0_4_;
  fVar148 = auVar22._4_4_ + auVar154._4_4_;
  fVar129 = auVar22._8_4_ + auVar154._8_4_;
  fVar145 = auVar22._12_4_ + auVar154._12_4_;
  auVar170 = vsubps_avx(auVar166,auVar114);
  auVar15 = vshufps_avx(auVar191,auVar191,0xff);
  auVar16 = vshufps_avx(auVar23,auVar23,0xff);
  auVar258._0_4_ = auVar16._0_4_ * fVar147;
  auVar258._4_4_ = auVar16._4_4_ * fVar165;
  auVar258._8_4_ = auVar16._8_4_ * fVar182;
  auVar258._12_4_ = auVar16._12_4_ * fVar183;
  auVar115._0_4_ = auVar15._0_4_ * fVar147 + auVar16._0_4_ * fVar100 * auVar19._0_4_ * fVar185;
  auVar115._4_4_ = auVar15._4_4_ * fVar165 + auVar16._4_4_ * fVar100 * auVar19._4_4_ * fVar185;
  auVar115._8_4_ = auVar15._8_4_ * fVar182 + auVar16._8_4_ * fVar100 * auVar19._8_4_ * fVar185;
  auVar115._12_4_ = auVar15._12_4_ * fVar183 + auVar16._12_4_ * fVar100 * auVar19._12_4_ * fVar185;
  auVar15 = vsubps_avx(auVar23,auVar258);
  auVar172._0_4_ = auVar23._0_4_ + auVar258._0_4_;
  auVar172._4_4_ = auVar23._4_4_ + auVar258._4_4_;
  auVar172._8_4_ = auVar23._8_4_ + auVar258._8_4_;
  auVar172._12_4_ = auVar23._12_4_ + auVar258._12_4_;
  auVar16 = vsubps_avx(auVar191,auVar115);
  local_538._0_4_ = auVar168._0_4_;
  local_538._4_4_ = auVar168._4_4_;
  uStack_530._0_4_ = auVar168._8_4_;
  uStack_530._4_4_ = auVar168._12_4_;
  auVar207._0_4_ = auVar20._0_4_ + (float)local_538._0_4_ * 0.33333334;
  auVar207._4_4_ = auVar20._4_4_ + (float)local_538._4_4_ * 0.33333334;
  auVar207._8_4_ = auVar20._8_4_ + (float)uStack_530 * 0.33333334;
  auVar207._12_4_ = auVar20._12_4_ + uStack_530._4_4_ * 0.33333334;
  fVar73 = 1.0 - fVar101;
  auVar116._4_4_ = fVar73;
  auVar116._0_4_ = fVar73;
  auVar116._8_4_ = fVar73;
  auVar116._12_4_ = fVar73;
  auVar283._0_4_ = fVar101 * auVar18._0_4_;
  auVar283._4_4_ = fVar101 * auVar18._4_4_;
  auVar283._8_4_ = fVar101 * auVar18._8_4_;
  auVar283._12_4_ = fVar101 * auVar18._12_4_;
  local_408 = vfmadd231ps_fma(auVar283,auVar116,auVar20);
  auVar83._0_4_ = fVar101 * (auVar18._0_4_ + auVar170._0_4_ * 0.33333334);
  auVar83._4_4_ = fVar101 * (auVar18._4_4_ + auVar170._4_4_ * 0.33333334);
  auVar83._8_4_ = fVar101 * (auVar18._8_4_ + auVar170._8_4_ * 0.33333334);
  auVar83._12_4_ = fVar101 * (auVar18._12_4_ + auVar170._12_4_ * 0.33333334);
  auVar168 = vfmadd231ps_fma(auVar83,auVar116,auVar207);
  local_558._0_4_ = auVar21._0_4_;
  local_558._4_4_ = auVar21._4_4_;
  uStack_550._0_4_ = auVar21._8_4_;
  uStack_550._4_4_ = auVar21._12_4_;
  auVar133._0_4_ = (float)local_558._0_4_ * 0.33333334;
  auVar133._4_4_ = (float)local_558._4_4_ * 0.33333334;
  auVar133._8_4_ = (float)uStack_550 * 0.33333334;
  auVar133._12_4_ = uStack_550._4_4_ * 0.33333334;
  auVar18 = vsubps_avx(auVar89,auVar133);
  auVar308._0_4_ = (float)local_628._0_4_ + (fVar268 + auVar81._0_4_) * 0.33333334;
  auVar308._4_4_ = (float)local_628._4_4_ + (fVar280 + auVar81._4_4_) * 0.33333334;
  auVar308._8_4_ = fStack_620 + (fVar291 + auVar81._8_4_) * 0.33333334;
  auVar308._12_4_ = fStack_61c + (fVar102 + auVar81._12_4_) * 0.33333334;
  auVar270._0_4_ = (fVar292 + auVar153._0_4_) * 0.33333334;
  auVar270._4_4_ = (fVar303 + auVar153._4_4_) * 0.33333334;
  auVar270._8_4_ = (fVar304 + auVar153._8_4_) * 0.33333334;
  auVar270._12_4_ = (fVar305 + auVar153._12_4_) * 0.33333334;
  auVar19 = vsubps_avx(_local_5a8,auVar270);
  auVar284._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar284._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar284._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar284._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar15,auVar284);
  auVar246._0_4_ = (fVar202 + auVar115._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar234 + auVar115._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar235 + auVar115._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar236 + auVar115._12_4_) * 0.33333334;
  auVar170 = vsubps_avx(auVar172,auVar246);
  auVar285._0_4_ = fVar101 * auVar16._0_4_;
  auVar285._4_4_ = fVar101 * auVar16._4_4_;
  auVar285._8_4_ = fVar101 * auVar16._8_4_;
  auVar285._12_4_ = fVar101 * auVar16._12_4_;
  auVar226._0_4_ = fVar101 * auVar15._0_4_;
  auVar226._4_4_ = fVar101 * auVar15._4_4_;
  auVar226._8_4_ = fVar101 * auVar15._8_4_;
  auVar226._12_4_ = fVar101 * auVar15._12_4_;
  local_418 = vfmadd231ps_fma(auVar285,auVar116,auVar18);
  local_428 = vfmadd231ps_fma(auVar226,auVar116,auVar89);
  auVar134._0_4_ = fVar101 * fVar149;
  auVar134._4_4_ = fVar101 * fVar148;
  auVar134._8_4_ = fVar101 * fVar129;
  auVar134._12_4_ = fVar101 * fVar145;
  auVar155._0_4_ = fVar101 * (fVar149 + (fVar237 + auVar114._0_4_) * 0.33333334);
  auVar155._4_4_ = fVar101 * (fVar148 + (fVar238 + auVar114._4_4_) * 0.33333334);
  auVar155._8_4_ = fVar101 * (fVar129 + (fVar239 + auVar114._8_4_) * 0.33333334);
  auVar155._12_4_ = fVar101 * (fVar145 + (fVar255 + auVar114._12_4_) * 0.33333334);
  auVar189._0_4_ = fVar101 * auVar170._0_4_;
  auVar189._4_4_ = fVar101 * auVar170._4_4_;
  auVar189._8_4_ = fVar101 * auVar170._8_4_;
  auVar189._12_4_ = fVar101 * auVar170._12_4_;
  auVar173._0_4_ = fVar101 * auVar172._0_4_;
  auVar173._4_4_ = fVar101 * auVar172._4_4_;
  auVar173._8_4_ = fVar101 * auVar172._8_4_;
  auVar173._12_4_ = fVar101 * auVar172._12_4_;
  _local_438 = vfmadd231ps_fma(auVar134,auVar116,_local_628);
  auVar21 = vfmadd231ps_fma(auVar155,auVar116,auVar308);
  _local_448 = vfmadd231ps_fma(auVar189,auVar116,auVar19);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar22 = vfmadd231ps_fma(auVar173,auVar116,_local_5a8);
  local_3e8 = vsubps_avx(local_408,auVar15);
  auVar16 = vshufps_avx(local_3e8,local_3e8,0x55);
  auVar89 = vshufps_avx(local_3e8,local_3e8,0xaa);
  aVar6 = pre->ray_space[k].vy.field_0;
  fVar73 = pre->ray_space[k].vz.field_0.m128[0];
  fVar100 = pre->ray_space[k].vz.field_0.m128[1];
  fVar101 = pre->ray_space[k].vz.field_0.m128[2];
  fVar149 = pre->ray_space[k].vz.field_0.m128[3];
  auVar84._0_4_ = fVar73 * auVar89._0_4_;
  auVar84._4_4_ = fVar100 * auVar89._4_4_;
  auVar84._8_4_ = fVar101 * auVar89._8_4_;
  auVar84._12_4_ = fVar149 * auVar89._12_4_;
  auVar18 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar16);
  local_3f8 = vsubps_avx(auVar168,auVar15);
  auVar16 = vshufps_avx(local_3f8,local_3f8,0x55);
  auVar89 = vshufps_avx(local_3f8,local_3f8,0xaa);
  auVar329._0_4_ = fVar73 * auVar89._0_4_;
  auVar329._4_4_ = fVar100 * auVar89._4_4_;
  auVar329._8_4_ = fVar101 * auVar89._8_4_;
  auVar329._12_4_ = fVar149 * auVar89._12_4_;
  auVar89 = vfmadd231ps_fma(auVar329,(undefined1  [16])aVar6,auVar16);
  local_268 = vsubps_avx(local_418,auVar15);
  auVar16 = vshufps_avx(local_268,local_268,0xaa);
  auVar309._0_4_ = fVar73 * auVar16._0_4_;
  auVar309._4_4_ = fVar100 * auVar16._4_4_;
  auVar309._8_4_ = fVar101 * auVar16._8_4_;
  auVar309._12_4_ = fVar149 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_268,local_268,0x55);
  auVar19 = vfmadd231ps_fma(auVar309,(undefined1  [16])aVar6,auVar16);
  local_278 = vsubps_avx(local_428,auVar15);
  auVar16 = vshufps_avx(local_278,local_278,0xaa);
  auVar321._0_4_ = fVar73 * auVar16._0_4_;
  auVar321._4_4_ = fVar100 * auVar16._4_4_;
  auVar321._8_4_ = fVar101 * auVar16._8_4_;
  auVar321._12_4_ = fVar149 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_278,local_278,0x55);
  auVar170 = vfmadd231ps_fma(auVar321,(undefined1  [16])aVar6,auVar16);
  local_288 = vsubps_avx(_local_438,auVar15);
  auVar16 = vshufps_avx(local_288,local_288,0xaa);
  auVar174._0_4_ = fVar73 * auVar16._0_4_;
  auVar174._4_4_ = fVar100 * auVar16._4_4_;
  auVar174._8_4_ = fVar101 * auVar16._8_4_;
  auVar174._12_4_ = fVar149 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_288,local_288,0x55);
  auVar20 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar16);
  local_298 = vsubps_avx(auVar21,auVar15);
  auVar16 = vshufps_avx(local_298,local_298,0xaa);
  auVar227._0_4_ = fVar73 * auVar16._0_4_;
  auVar227._4_4_ = fVar100 * auVar16._4_4_;
  auVar227._8_4_ = fVar101 * auVar16._8_4_;
  auVar227._12_4_ = fVar149 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_298,local_298,0x55);
  auVar23 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar6,auVar16);
  local_2a8 = vsubps_avx(_local_448,auVar15);
  auVar16 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar259._0_4_ = fVar73 * auVar16._0_4_;
  auVar259._4_4_ = fVar100 * auVar16._4_4_;
  auVar259._8_4_ = fVar101 * auVar16._8_4_;
  auVar259._12_4_ = fVar149 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2a8,local_2a8,0x55);
  auVar16 = vfmadd231ps_fma(auVar259,(undefined1  [16])aVar6,auVar16);
  local_2b8 = vsubps_avx(auVar22,auVar15);
  auVar15 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar190._0_4_ = fVar73 * auVar15._0_4_;
  auVar190._4_4_ = fVar100 * auVar15._4_4_;
  auVar190._8_4_ = fVar101 * auVar15._8_4_;
  auVar190._12_4_ = fVar149 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar15 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar6,auVar15);
  auVar208._4_4_ = local_3e8._0_4_;
  auVar208._0_4_ = local_3e8._0_4_;
  auVar208._8_4_ = local_3e8._0_4_;
  auVar208._12_4_ = local_3e8._0_4_;
  aVar6 = pre->ray_space[k].vx.field_0;
  auVar32 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar6,auVar208);
  auVar209._4_4_ = local_3f8._0_4_;
  auVar209._0_4_ = local_3f8._0_4_;
  auVar209._8_4_ = local_3f8._0_4_;
  auVar209._12_4_ = local_3f8._0_4_;
  auVar77 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar6,auVar209);
  uVar74 = local_268._0_4_;
  auVar210._4_4_ = uVar74;
  auVar210._0_4_ = uVar74;
  auVar210._8_4_ = uVar74;
  auVar210._12_4_ = uVar74;
  auVar294 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar210);
  uVar74 = local_278._0_4_;
  auVar211._4_4_ = uVar74;
  auVar211._0_4_ = uVar74;
  auVar211._8_4_ = uVar74;
  auVar211._12_4_ = uVar74;
  auVar75 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar6,auVar211);
  uVar74 = local_288._0_4_;
  auVar212._4_4_ = uVar74;
  auVar212._0_4_ = uVar74;
  auVar212._8_4_ = uVar74;
  auVar212._12_4_ = uVar74;
  auVar76 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar212);
  uVar74 = local_298._0_4_;
  auVar213._4_4_ = uVar74;
  auVar213._0_4_ = uVar74;
  auVar213._8_4_ = uVar74;
  auVar213._12_4_ = uVar74;
  auVar23 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar6,auVar213);
  uVar74 = local_2a8._0_4_;
  auVar214._4_4_ = uVar74;
  auVar214._0_4_ = uVar74;
  auVar214._8_4_ = uVar74;
  auVar214._12_4_ = uVar74;
  auVar104 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar214);
  uVar74 = local_2b8._0_4_;
  auVar215._4_4_ = uVar74;
  auVar215._0_4_ = uVar74;
  auVar215._8_4_ = uVar74;
  auVar215._12_4_ = uVar74;
  auVar105 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar215);
  auVar18 = vmovlhps_avx(auVar32,auVar76);
  auVar19 = vmovlhps_avx(auVar77,auVar23);
  auVar170 = vmovlhps_avx(auVar294,auVar104);
  auVar20 = vmovlhps_avx(auVar75,auVar105);
  auVar15 = vminps_avx(auVar18,auVar19);
  auVar16 = vminps_avx(auVar170,auVar20);
  auVar89 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar18,auVar19);
  auVar16 = vmaxps_avx(auVar170,auVar20);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vshufpd_avx(auVar89,auVar89,3);
  auVar89 = vminps_avx(auVar89,auVar16);
  auVar16 = vshufpd_avx(auVar15,auVar15,3);
  auVar16 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vandps_avx(auVar328,auVar89);
  auVar16 = vandps_avx(auVar16,auVar328);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar16,auVar15);
  fVar100 = auVar15._0_4_ * 9.536743e-07;
  auVar247._8_8_ = auVar32._0_8_;
  auVar247._0_8_ = auVar32._0_8_;
  auVar271._8_8_ = auVar77._0_8_;
  auVar271._0_8_ = auVar77._0_8_;
  auVar310._0_8_ = auVar294._0_8_;
  auVar310._8_8_ = auVar310._0_8_;
  auVar322._0_8_ = auVar75._0_8_;
  auVar322._8_8_ = auVar322._0_8_;
  local_228 = -fVar100;
  fStack_224 = local_228;
  fStack_220 = local_228;
  fStack_21c = local_228;
  fStack_218 = local_228;
  fStack_214 = local_228;
  fStack_210 = local_228;
  fStack_20c = local_228;
  local_2e8 = uVar62;
  uStack_2e4 = uVar62;
  uStack_2e0 = uVar62;
  uStack_2dc = uVar62;
  uStack_2f4 = local_2f8;
  uStack_2f0 = local_2f8;
  uStack_2ec = local_2f8;
  uVar63 = 0;
  uVar70 = 0;
  fVar73 = *(float *)(ray + k * 4 + 0x30);
  local_238 = vsubps_avx(auVar19,auVar18);
  local_248 = vsubps_avx(auVar170,auVar19);
  local_258 = vsubps_avx(auVar20,auVar170);
  local_308 = vsubps_avx(_local_438,local_408);
  local_318 = vsubps_avx(auVar21,auVar168);
  local_328 = vsubps_avx(_local_448,local_418);
  _local_338 = vsubps_avx(auVar22,local_428);
  auVar335 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar302 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_208 = fVar100;
  fStack_204 = fVar100;
  fStack_200 = fVar100;
  fStack_1fc = fVar100;
  fStack_1f8 = fVar100;
  fStack_1f4 = fVar100;
  fStack_1f0 = fVar100;
  fStack_1ec = fVar100;
LAB_016dccda:
  local_2c8 = auVar302._0_16_;
  auVar191 = auVar335._0_16_;
  auVar15 = vshufps_avx(auVar191,auVar191,0x50);
  auVar330._8_4_ = 0x3f800000;
  auVar330._0_8_ = 0x3f8000003f800000;
  auVar330._12_4_ = 0x3f800000;
  auVar333._16_4_ = 0x3f800000;
  auVar333._0_16_ = auVar330;
  auVar333._20_4_ = 0x3f800000;
  auVar333._24_4_ = 0x3f800000;
  auVar333._28_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar330,auVar15);
  fVar101 = auVar15._0_4_;
  fVar165 = auVar76._0_4_;
  auVar85._0_4_ = fVar165 * fVar101;
  fVar149 = auVar15._4_4_;
  fVar182 = auVar76._4_4_;
  auVar85._4_4_ = fVar182 * fVar149;
  fVar185 = auVar15._8_4_;
  auVar85._8_4_ = fVar165 * fVar185;
  fVar148 = auVar15._12_4_;
  auVar85._12_4_ = fVar182 * fVar148;
  fVar184 = auVar23._0_4_;
  auVar216._0_4_ = fVar184 * fVar101;
  fVar202 = auVar23._4_4_;
  auVar216._4_4_ = fVar202 * fVar149;
  auVar216._8_4_ = fVar184 * fVar185;
  auVar216._12_4_ = fVar202 * fVar148;
  fVar255 = auVar104._0_4_;
  auVar175._0_4_ = fVar255 * fVar101;
  fVar268 = auVar104._4_4_;
  auVar175._4_4_ = fVar268 * fVar149;
  auVar175._8_4_ = fVar255 * fVar185;
  auVar175._12_4_ = fVar268 * fVar148;
  fVar280 = auVar105._0_4_;
  auVar135._0_4_ = fVar280 * fVar101;
  fVar291 = auVar105._4_4_;
  auVar135._4_4_ = fVar291 * fVar149;
  auVar135._8_4_ = fVar280 * fVar185;
  auVar135._12_4_ = fVar291 * fVar148;
  auVar77 = vfmadd231ps_fma(auVar85,auVar16,auVar247);
  auVar294 = vfmadd231ps_fma(auVar216,auVar16,auVar271);
  auVar75 = vfmadd231ps_fma(auVar175,auVar16,auVar310);
  auVar106 = vfmadd231ps_fma(auVar135,auVar322,auVar16);
  auVar15 = vmovshdup_avx(auVar302._0_16_);
  fVar101 = auVar302._0_4_;
  fStack_c0 = (auVar15._0_4_ - fVar101) * 0.04761905;
  auVar267._4_4_ = fVar101;
  auVar267._0_4_ = fVar101;
  auVar267._8_4_ = fVar101;
  auVar267._12_4_ = fVar101;
  auVar267._16_4_ = fVar101;
  auVar267._20_4_ = fVar101;
  auVar267._24_4_ = fVar101;
  auVar267._28_4_ = fVar101;
  auVar125._0_8_ = auVar15._0_8_;
  auVar125._8_8_ = auVar125._0_8_;
  auVar125._16_8_ = auVar125._0_8_;
  auVar125._24_8_ = auVar125._0_8_;
  auVar97 = vsubps_avx(auVar125,auVar267);
  uVar74 = auVar77._0_4_;
  auVar326._4_4_ = uVar74;
  auVar326._0_4_ = uVar74;
  auVar326._8_4_ = uVar74;
  auVar326._12_4_ = uVar74;
  auVar326._16_4_ = uVar74;
  auVar326._20_4_ = uVar74;
  auVar326._24_4_ = uVar74;
  auVar326._28_4_ = uVar74;
  auVar15 = vmovshdup_avx(auVar77);
  uVar103 = auVar15._0_8_;
  auVar316._8_8_ = uVar103;
  auVar316._0_8_ = uVar103;
  auVar316._16_8_ = uVar103;
  auVar316._24_8_ = uVar103;
  fVar183 = auVar294._0_4_;
  auVar299._4_4_ = fVar183;
  auVar299._0_4_ = fVar183;
  auVar299._8_4_ = fVar183;
  auVar299._12_4_ = fVar183;
  auVar299._16_4_ = fVar183;
  auVar299._20_4_ = fVar183;
  auVar299._24_4_ = fVar183;
  auVar299._28_4_ = fVar183;
  auVar16 = vmovshdup_avx(auVar294);
  auVar126._0_8_ = auVar16._0_8_;
  auVar126._8_8_ = auVar126._0_8_;
  auVar126._16_8_ = auVar126._0_8_;
  auVar126._24_8_ = auVar126._0_8_;
  fVar147 = auVar75._0_4_;
  auVar231._4_4_ = fVar147;
  auVar231._0_4_ = fVar147;
  auVar231._8_4_ = fVar147;
  auVar231._12_4_ = fVar147;
  auVar231._16_4_ = fVar147;
  auVar231._20_4_ = fVar147;
  auVar231._24_4_ = fVar147;
  auVar231._28_4_ = fVar147;
  auVar89 = vmovshdup_avx(auVar75);
  auVar253._0_8_ = auVar89._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar253._16_8_ = auVar253._0_8_;
  auVar253._24_8_ = auVar253._0_8_;
  fVar146 = auVar106._0_4_;
  auVar32 = vmovshdup_avx(auVar106);
  auVar286 = vfmadd132ps_fma(auVar97,auVar267,_DAT_01faff20);
  auVar97 = vsubps_avx(auVar333,ZEXT1632(auVar286));
  fVar101 = auVar286._0_4_;
  fVar149 = auVar286._4_4_;
  auVar24._4_4_ = fVar183 * fVar149;
  auVar24._0_4_ = fVar183 * fVar101;
  fVar185 = auVar286._8_4_;
  auVar24._8_4_ = fVar183 * fVar185;
  fVar148 = auVar286._12_4_;
  auVar24._12_4_ = fVar183 * fVar148;
  auVar24._16_4_ = fVar183 * 0.0;
  auVar24._20_4_ = fVar183 * 0.0;
  auVar24._24_4_ = fVar183 * 0.0;
  auVar24._28_4_ = 0x3f800000;
  auVar286 = vfmadd231ps_fma(auVar24,auVar97,auVar326);
  fVar129 = auVar16._0_4_;
  fVar145 = auVar16._4_4_;
  auVar25._4_4_ = fVar145 * fVar149;
  auVar25._0_4_ = fVar129 * fVar101;
  auVar25._8_4_ = fVar129 * fVar185;
  auVar25._12_4_ = fVar145 * fVar148;
  auVar25._16_4_ = fVar129 * 0.0;
  auVar25._20_4_ = fVar145 * 0.0;
  auVar25._24_4_ = fVar129 * 0.0;
  auVar25._28_4_ = uVar74;
  auVar130 = vfmadd231ps_fma(auVar25,auVar97,auVar316);
  auVar26._4_4_ = fVar147 * fVar149;
  auVar26._0_4_ = fVar147 * fVar101;
  auVar26._8_4_ = fVar147 * fVar185;
  auVar26._12_4_ = fVar147 * fVar148;
  auVar26._16_4_ = fVar147 * 0.0;
  auVar26._20_4_ = fVar147 * 0.0;
  auVar26._24_4_ = fVar147 * 0.0;
  auVar26._28_4_ = auVar15._4_4_;
  auVar131 = vfmadd231ps_fma(auVar26,auVar97,auVar299);
  fVar129 = auVar89._0_4_;
  fVar145 = auVar89._4_4_;
  auVar17._4_4_ = fVar145 * fVar149;
  auVar17._0_4_ = fVar129 * fVar101;
  auVar17._8_4_ = fVar129 * fVar185;
  auVar17._12_4_ = fVar145 * fVar148;
  auVar17._16_4_ = fVar129 * 0.0;
  auVar17._20_4_ = fVar145 * 0.0;
  auVar17._24_4_ = fVar129 * 0.0;
  auVar17._28_4_ = fVar183;
  auVar157 = vfmadd231ps_fma(auVar17,auVar97,auVar126);
  auVar15 = vshufps_avx(auVar77,auVar77,0xaa);
  uStack_550 = auVar15._0_8_;
  local_558 = (undefined1  [8])uStack_550;
  uStack_548 = uStack_550;
  uStack_540 = uStack_550;
  auVar16 = vshufps_avx(auVar77,auVar77,0xff);
  uStack_600 = auVar16._0_8_;
  local_608 = (undefined1  [8])uStack_600;
  uStack_5f8 = uStack_600;
  uStack_5f0 = uStack_600;
  auVar27._4_4_ = fVar146 * fVar149;
  auVar27._0_4_ = fVar146 * fVar101;
  auVar27._8_4_ = fVar146 * fVar185;
  auVar27._12_4_ = fVar146 * fVar148;
  auVar27._16_4_ = fVar146 * 0.0;
  auVar27._20_4_ = fVar146 * 0.0;
  auVar27._24_4_ = fVar146 * 0.0;
  auVar27._28_4_ = fVar146;
  auVar77 = vfmadd231ps_fma(auVar27,auVar97,auVar231);
  auVar16 = vshufps_avx(auVar294,auVar294,0xaa);
  auVar232._0_8_ = auVar16._0_8_;
  auVar232._8_8_ = auVar232._0_8_;
  auVar232._16_8_ = auVar232._0_8_;
  auVar232._24_8_ = auVar232._0_8_;
  auVar89 = vshufps_avx(auVar294,auVar294,0xff);
  uStack_530 = auVar89._0_8_;
  local_538 = (undefined1  [8])uStack_530;
  uStack_528 = uStack_530;
  uStack_520 = uStack_530;
  fVar129 = auVar32._0_4_;
  fVar145 = auVar32._4_4_;
  auVar28._4_4_ = fVar145 * fVar149;
  auVar28._0_4_ = fVar129 * fVar101;
  auVar28._8_4_ = fVar129 * fVar185;
  auVar28._12_4_ = fVar145 * fVar148;
  auVar28._16_4_ = fVar129 * 0.0;
  auVar28._20_4_ = fVar145 * 0.0;
  auVar28._24_4_ = fVar129 * 0.0;
  auVar28._28_4_ = auVar15._4_4_;
  auVar166 = vfmadd231ps_fma(auVar28,auVar97,auVar253);
  auVar29._28_4_ = fVar145;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar131._12_4_ * fVar148,
                          CONCAT48(auVar131._8_4_ * fVar185,
                                   CONCAT44(auVar131._4_4_ * fVar149,auVar131._0_4_ * fVar101))));
  auVar286 = vfmadd231ps_fma(auVar29,auVar97,ZEXT1632(auVar286));
  fVar129 = auVar89._4_4_;
  auVar30._28_4_ = fVar129;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar157._12_4_ * fVar148,
                          CONCAT48(auVar157._8_4_ * fVar185,
                                   CONCAT44(auVar157._4_4_ * fVar149,auVar157._0_4_ * fVar101))));
  auVar130 = vfmadd231ps_fma(auVar30,auVar97,ZEXT1632(auVar130));
  auVar15 = vshufps_avx(auVar75,auVar75,0xaa);
  uVar103 = auVar15._0_8_;
  auVar220._8_8_ = uVar103;
  auVar220._0_8_ = uVar103;
  auVar220._16_8_ = uVar103;
  auVar220._24_8_ = uVar103;
  auVar32 = vshufps_avx(auVar75,auVar75,0xff);
  uVar103 = auVar32._0_8_;
  auVar334._8_8_ = uVar103;
  auVar334._0_8_ = uVar103;
  auVar334._16_8_ = uVar103;
  auVar334._24_8_ = uVar103;
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar77._12_4_ * fVar148,
                                               CONCAT48(auVar77._8_4_ * fVar185,
                                                        CONCAT44(auVar77._4_4_ * fVar149,
                                                                 auVar77._0_4_ * fVar101)))),auVar97
                            ,ZEXT1632(auVar131));
  auVar77 = vshufps_avx(auVar106,auVar106,0xaa);
  auVar294 = vshufps_avx(auVar106,auVar106,0xff);
  auVar106 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar148 * auVar166._12_4_,
                                                CONCAT48(fVar185 * auVar166._8_4_,
                                                         CONCAT44(fVar149 * auVar166._4_4_,
                                                                  fVar101 * auVar166._0_4_)))),
                             auVar97,ZEXT1632(auVar157));
  auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar148 * auVar75._12_4_,
                                                CONCAT48(fVar185 * auVar75._8_4_,
                                                         CONCAT44(fVar149 * auVar75._4_4_,
                                                                  fVar101 * auVar75._0_4_)))),
                             auVar97,ZEXT1632(auVar286));
  auVar24 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar286));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar148 * auVar106._12_4_,
                                               CONCAT48(fVar185 * auVar106._8_4_,
                                                        CONCAT44(fVar149 * auVar106._4_4_,
                                                                 fVar101 * auVar106._0_4_)))),
                            auVar97,ZEXT1632(auVar130));
  auVar25 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar130));
  fStack_46c = auVar25._28_4_;
  auVar300._0_4_ = fStack_c0 * auVar24._0_4_ * 3.0;
  auVar300._4_4_ = fStack_c0 * auVar24._4_4_ * 3.0;
  auVar300._8_4_ = fStack_c0 * auVar24._8_4_ * 3.0;
  auVar300._12_4_ = fStack_c0 * auVar24._12_4_ * 3.0;
  auVar300._16_4_ = fStack_c0 * auVar24._16_4_ * 3.0;
  auVar300._20_4_ = fStack_c0 * auVar24._20_4_ * 3.0;
  auVar300._24_4_ = fStack_c0 * auVar24._24_4_ * 3.0;
  auVar300._28_4_ = 0;
  local_488._0_4_ = fStack_c0 * auVar25._0_4_ * 3.0;
  local_488._4_4_ = fStack_c0 * auVar25._4_4_ * 3.0;
  fStack_480 = fStack_c0 * auVar25._8_4_ * 3.0;
  fStack_47c = fStack_c0 * auVar25._12_4_ * 3.0;
  fStack_478 = fStack_c0 * auVar25._16_4_ * 3.0;
  fStack_474 = fStack_c0 * auVar25._20_4_ * 3.0;
  fStack_470 = fStack_c0 * auVar25._24_4_ * 3.0;
  fVar145 = auVar16._0_4_;
  fVar146 = auVar16._4_4_;
  auVar301._4_4_ = fVar146 * fVar149;
  auVar301._0_4_ = fVar145 * fVar101;
  auVar301._8_4_ = fVar145 * fVar185;
  auVar301._12_4_ = fVar146 * fVar148;
  auVar301._16_4_ = fVar145 * 0.0;
  auVar301._20_4_ = fVar146 * 0.0;
  auVar301._24_4_ = fVar145 * 0.0;
  auVar301._28_4_ = fStack_46c;
  auVar16 = vfmadd231ps_fma(auVar301,auVar97,_local_558);
  fVar145 = auVar89._0_4_;
  auVar33._4_4_ = fVar129 * fVar149;
  auVar33._0_4_ = fVar145 * fVar101;
  auVar33._8_4_ = fVar145 * fVar185;
  auVar33._12_4_ = fVar129 * fVar148;
  auVar33._16_4_ = fVar145 * 0.0;
  auVar33._20_4_ = fVar129 * 0.0;
  auVar33._24_4_ = fVar145 * 0.0;
  auVar33._28_4_ = 0;
  auVar89 = vfmadd231ps_fma(auVar33,auVar97,_local_608);
  fVar129 = auVar15._0_4_;
  fVar145 = auVar15._4_4_;
  auVar34._4_4_ = fVar145 * fVar149;
  auVar34._0_4_ = fVar129 * fVar101;
  auVar34._8_4_ = fVar129 * fVar185;
  auVar34._12_4_ = fVar145 * fVar148;
  auVar34._16_4_ = fVar129 * 0.0;
  auVar34._20_4_ = fVar145 * 0.0;
  auVar34._24_4_ = fVar129 * 0.0;
  auVar34._28_4_ = auVar24._28_4_;
  auVar15 = vfmadd231ps_fma(auVar34,auVar97,auVar232);
  fVar129 = auVar32._0_4_;
  fVar147 = auVar32._4_4_;
  auVar35._4_4_ = fVar147 * fVar149;
  auVar35._0_4_ = fVar129 * fVar101;
  auVar35._8_4_ = fVar129 * fVar185;
  auVar35._12_4_ = fVar147 * fVar148;
  auVar35._16_4_ = fVar129 * 0.0;
  auVar35._20_4_ = fVar147 * 0.0;
  auVar35._24_4_ = fVar129 * 0.0;
  auVar35._28_4_ = fVar146;
  auVar32 = vfmadd231ps_fma(auVar35,auVar97,_local_538);
  auVar27 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar131));
  fVar129 = auVar77._0_4_;
  fVar145 = auVar77._4_4_;
  auVar36._4_4_ = fVar145 * fVar149;
  auVar36._0_4_ = fVar129 * fVar101;
  auVar36._8_4_ = fVar129 * fVar185;
  auVar36._12_4_ = fVar145 * fVar148;
  auVar36._16_4_ = fVar129 * 0.0;
  auVar36._20_4_ = fVar145 * 0.0;
  auVar36._24_4_ = fVar129 * 0.0;
  auVar36._28_4_ = fVar145;
  auVar77 = vfmadd231ps_fma(auVar36,auVar97,auVar220);
  auVar28 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  fVar129 = auVar294._0_4_;
  fVar145 = auVar294._4_4_;
  auVar37._4_4_ = fVar145 * fVar149;
  auVar37._0_4_ = fVar129 * fVar101;
  auVar37._8_4_ = fVar129 * fVar185;
  auVar37._12_4_ = fVar145 * fVar148;
  auVar37._16_4_ = fVar129 * 0.0;
  auVar37._20_4_ = fVar145 * 0.0;
  auVar37._24_4_ = fVar129 * 0.0;
  auVar37._28_4_ = fVar145;
  auVar294 = vfmadd231ps_fma(auVar37,auVar97,auVar334);
  auVar38._28_4_ = fVar147;
  auVar38._0_28_ =
       ZEXT1628(CONCAT412(auVar15._12_4_ * fVar148,
                          CONCAT48(auVar15._8_4_ * fVar185,
                                   CONCAT44(auVar15._4_4_ * fVar149,auVar15._0_4_ * fVar101))));
  auVar16 = vfmadd231ps_fma(auVar38,auVar97,ZEXT1632(auVar16));
  auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar148 * auVar32._12_4_,
                                               CONCAT48(fVar185 * auVar32._8_4_,
                                                        CONCAT44(fVar149 * auVar32._4_4_,
                                                                 fVar101 * auVar32._0_4_)))),auVar97
                            ,ZEXT1632(auVar89));
  auVar127._0_4_ = auVar131._0_4_ + auVar300._0_4_;
  auVar127._4_4_ = auVar131._4_4_ + auVar300._4_4_;
  auVar127._8_4_ = auVar131._8_4_ + auVar300._8_4_;
  auVar127._12_4_ = auVar131._12_4_ + auVar300._12_4_;
  auVar127._16_4_ = auVar300._16_4_ + 0.0;
  auVar127._20_4_ = auVar300._20_4_ + 0.0;
  auVar127._24_4_ = auVar300._24_4_ + 0.0;
  auVar127._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar77._12_4_ * fVar148,
                                               CONCAT48(auVar77._8_4_ * fVar185,
                                                        CONCAT44(auVar77._4_4_ * fVar149,
                                                                 auVar77._0_4_ * fVar101)))),auVar97
                            ,ZEXT1632(auVar15));
  auVar32 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar294._12_4_ * fVar148,
                                               CONCAT48(auVar294._8_4_ * fVar185,
                                                        CONCAT44(auVar294._4_4_ * fVar149,
                                                                 auVar294._0_4_ * fVar101)))),
                            auVar97,ZEXT1632(auVar32));
  auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar148 * auVar15._12_4_,
                                               CONCAT48(fVar185 * auVar15._8_4_,
                                                        CONCAT44(fVar149 * auVar15._4_4_,
                                                                 fVar101 * auVar15._0_4_)))),auVar97
                            ,ZEXT1632(auVar16));
  auVar294 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar32._12_4_ * fVar148,
                                                CONCAT48(auVar32._8_4_ * fVar185,
                                                         CONCAT44(auVar32._4_4_ * fVar149,
                                                                  auVar32._0_4_ * fVar101)))),
                             ZEXT1632(auVar89),auVar97);
  auVar97 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
  auVar24 = vsubps_avx(ZEXT1632(auVar32),ZEXT1632(auVar89));
  auVar327._0_4_ = fStack_c0 * auVar97._0_4_ * 3.0;
  auVar327._4_4_ = fStack_c0 * auVar97._4_4_ * 3.0;
  auVar327._8_4_ = fStack_c0 * auVar97._8_4_ * 3.0;
  auVar327._12_4_ = fStack_c0 * auVar97._12_4_ * 3.0;
  auVar327._16_4_ = fStack_c0 * auVar97._16_4_ * 3.0;
  auVar327._20_4_ = fStack_c0 * auVar97._20_4_ * 3.0;
  auVar327._24_4_ = fStack_c0 * auVar97._24_4_ * 3.0;
  auVar327._28_4_ = 0;
  local_d8 = fStack_c0 * auVar24._0_4_ * 3.0;
  fStack_d4 = fStack_c0 * auVar24._4_4_ * 3.0;
  auVar39._4_4_ = fStack_d4;
  auVar39._0_4_ = local_d8;
  fStack_d0 = fStack_c0 * auVar24._8_4_ * 3.0;
  auVar39._8_4_ = fStack_d0;
  fStack_cc = fStack_c0 * auVar24._12_4_ * 3.0;
  auVar39._12_4_ = fStack_cc;
  fStack_c8 = fStack_c0 * auVar24._16_4_ * 3.0;
  auVar39._16_4_ = fStack_c8;
  fStack_c4 = fStack_c0 * auVar24._20_4_ * 3.0;
  auVar39._20_4_ = fStack_c4;
  fStack_c0 = fStack_c0 * auVar24._24_4_ * 3.0;
  auVar39._24_4_ = fStack_c0;
  auVar39._28_4_ = 0x40400000;
  auVar29 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar77));
  local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar294));
  auVar97 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar131));
  auVar24 = vsubps_avx(ZEXT1632(auVar294),ZEXT1632(auVar75));
  auVar25 = vsubps_avx(auVar29,auVar27);
  fVar183 = auVar97._0_4_ + auVar25._0_4_;
  fVar234 = auVar97._4_4_ + auVar25._4_4_;
  fVar235 = auVar97._8_4_ + auVar25._8_4_;
  fVar236 = auVar97._12_4_ + auVar25._12_4_;
  fVar237 = auVar97._16_4_ + auVar25._16_4_;
  fVar238 = auVar97._20_4_ + auVar25._20_4_;
  fVar239 = auVar97._24_4_ + auVar25._24_4_;
  auVar26 = vsubps_avx(local_3b8,auVar28);
  auVar98._0_4_ = auVar24._0_4_ + auVar26._0_4_;
  auVar98._4_4_ = auVar24._4_4_ + auVar26._4_4_;
  auVar98._8_4_ = auVar24._8_4_ + auVar26._8_4_;
  auVar98._12_4_ = auVar24._12_4_ + auVar26._12_4_;
  auVar98._16_4_ = auVar24._16_4_ + auVar26._16_4_;
  auVar98._20_4_ = auVar24._20_4_ + auVar26._20_4_;
  auVar98._24_4_ = auVar24._24_4_ + auVar26._24_4_;
  auVar98._28_4_ = auVar24._28_4_ + auVar26._28_4_;
  local_78 = ZEXT1632(auVar75);
  fVar101 = auVar75._0_4_;
  local_f8 = (float)local_488._0_4_ + fVar101;
  fVar149 = auVar75._4_4_;
  fStack_f4 = (float)local_488._4_4_ + fVar149;
  fVar185 = auVar75._8_4_;
  fStack_f0 = fStack_480 + fVar185;
  fVar148 = auVar75._12_4_;
  fStack_ec = fStack_47c + fVar148;
  fStack_e8 = fStack_478 + 0.0;
  fStack_e4 = fStack_474 + 0.0;
  fStack_e0 = fStack_470 + 0.0;
  _local_3d8 = ZEXT1632(auVar131);
  auVar24 = vsubps_avx(_local_3d8,auVar300);
  local_358 = vpermps_avx2(_DAT_01fec480,auVar24);
  auVar24 = vsubps_avx(local_78,_local_488);
  local_118 = vpermps_avx2(_DAT_01fec480,auVar24);
  local_98._0_4_ = auVar77._0_4_ + auVar327._0_4_;
  local_98._4_4_ = auVar77._4_4_ + auVar327._4_4_;
  local_98._8_4_ = auVar77._8_4_ + auVar327._8_4_;
  local_98._12_4_ = auVar77._12_4_ + auVar327._12_4_;
  local_98._16_4_ = auVar327._16_4_ + 0.0;
  local_98._20_4_ = auVar327._20_4_ + 0.0;
  local_98._24_4_ = auVar327._24_4_ + 0.0;
  local_98._28_4_ = 0;
  auVar301 = ZEXT1632(auVar77);
  auVar24 = vsubps_avx(auVar301,auVar327);
  auVar30 = vpermps_avx2(_DAT_01fec480,auVar24);
  fVar129 = auVar294._0_4_;
  local_d8 = fVar129 + local_d8;
  fVar145 = auVar294._4_4_;
  fStack_d4 = fVar145 + fStack_d4;
  fVar146 = auVar294._8_4_;
  fStack_d0 = fVar146 + fStack_d0;
  fVar147 = auVar294._12_4_;
  fStack_cc = fVar147 + fStack_cc;
  fStack_c8 = fStack_c8 + 0.0;
  fStack_c4 = fStack_c4 + 0.0;
  fStack_c0 = fStack_c0 + 0.0;
  auVar24 = vsubps_avx(ZEXT1632(auVar294),auVar39);
  local_b8 = vpermps_avx2(_DAT_01fec480,auVar24);
  auVar40._4_4_ = fVar149 * fVar234;
  auVar40._0_4_ = fVar101 * fVar183;
  auVar40._8_4_ = fVar185 * fVar235;
  auVar40._12_4_ = fVar148 * fVar236;
  auVar40._16_4_ = fVar237 * 0.0;
  auVar40._20_4_ = fVar238 * 0.0;
  auVar40._24_4_ = fVar239 * 0.0;
  auVar40._28_4_ = auVar24._28_4_;
  auVar15 = vfnmadd231ps_fma(auVar40,_local_3d8,auVar98);
  fStack_dc = fStack_46c + 0.0;
  auVar41._4_4_ = fStack_f4 * fVar234;
  auVar41._0_4_ = local_f8 * fVar183;
  auVar41._8_4_ = fStack_f0 * fVar235;
  auVar41._12_4_ = fStack_ec * fVar236;
  auVar41._16_4_ = fStack_e8 * fVar237;
  auVar41._20_4_ = fStack_e4 * fVar238;
  auVar41._24_4_ = fStack_e0 * fVar239;
  auVar41._28_4_ = 0;
  auVar16 = vfnmadd231ps_fma(auVar41,auVar98,auVar127);
  auVar42._4_4_ = local_118._4_4_ * fVar234;
  auVar42._0_4_ = local_118._0_4_ * fVar183;
  auVar42._8_4_ = local_118._8_4_ * fVar235;
  auVar42._12_4_ = local_118._12_4_ * fVar236;
  auVar42._16_4_ = local_118._16_4_ * fVar237;
  auVar42._20_4_ = local_118._20_4_ * fVar238;
  auVar42._24_4_ = local_118._24_4_ * fVar239;
  auVar42._28_4_ = fStack_46c + 0.0;
  auVar89 = vfnmadd231ps_fma(auVar42,local_358,auVar98);
  local_608._0_4_ = auVar28._0_4_;
  local_608._4_4_ = auVar28._4_4_;
  uStack_600._0_4_ = auVar28._8_4_;
  uStack_600._4_4_ = auVar28._12_4_;
  uStack_5f8._0_4_ = auVar28._16_4_;
  uStack_5f8._4_4_ = auVar28._20_4_;
  uStack_5f0._0_4_ = auVar28._24_4_;
  uStack_5f0._4_4_ = auVar28._28_4_;
  auVar43._4_4_ = (float)local_608._4_4_ * fVar234;
  auVar43._0_4_ = (float)local_608._0_4_ * fVar183;
  auVar43._8_4_ = (float)uStack_600 * fVar235;
  auVar43._12_4_ = uStack_600._4_4_ * fVar236;
  auVar43._16_4_ = (float)uStack_5f8 * fVar237;
  auVar43._20_4_ = uStack_5f8._4_4_ * fVar238;
  auVar43._24_4_ = (float)uStack_5f0 * fVar239;
  auVar43._28_4_ = uStack_5f0._4_4_;
  auVar32 = vfnmadd231ps_fma(auVar43,auVar27,auVar98);
  auVar254._0_4_ = fVar129 * fVar183;
  auVar254._4_4_ = fVar145 * fVar234;
  auVar254._8_4_ = fVar146 * fVar235;
  auVar254._12_4_ = fVar147 * fVar236;
  auVar254._16_4_ = fVar237 * 0.0;
  auVar254._20_4_ = fVar238 * 0.0;
  auVar254._24_4_ = fVar239 * 0.0;
  auVar254._28_4_ = 0;
  auVar77 = vfnmadd231ps_fma(auVar254,auVar301,auVar98);
  uStack_bc = 0x40400000;
  auVar44._4_4_ = fStack_d4 * fVar234;
  auVar44._0_4_ = local_d8 * fVar183;
  auVar44._8_4_ = fStack_d0 * fVar235;
  auVar44._12_4_ = fStack_cc * fVar236;
  auVar44._16_4_ = fStack_c8 * fVar237;
  auVar44._20_4_ = fStack_c4 * fVar238;
  auVar44._24_4_ = fStack_c0 * fVar239;
  auVar44._28_4_ = auVar27._28_4_;
  auVar75 = vfnmadd231ps_fma(auVar44,local_98,auVar98);
  auVar45._4_4_ = local_b8._4_4_ * fVar234;
  auVar45._0_4_ = local_b8._0_4_ * fVar183;
  auVar45._8_4_ = local_b8._8_4_ * fVar235;
  auVar45._12_4_ = local_b8._12_4_ * fVar236;
  auVar45._16_4_ = local_b8._16_4_ * fVar237;
  auVar45._20_4_ = local_b8._20_4_ * fVar238;
  auVar45._24_4_ = local_b8._24_4_ * fVar239;
  auVar45._28_4_ = local_b8._28_4_;
  auVar106 = vfnmadd231ps_fma(auVar45,auVar30,auVar98);
  auVar46._4_4_ = local_3b8._4_4_ * fVar234;
  auVar46._0_4_ = local_3b8._0_4_ * fVar183;
  auVar46._8_4_ = local_3b8._8_4_ * fVar235;
  auVar46._12_4_ = local_3b8._12_4_ * fVar236;
  auVar46._16_4_ = local_3b8._16_4_ * fVar237;
  auVar46._20_4_ = local_3b8._20_4_ * fVar238;
  auVar46._24_4_ = local_3b8._24_4_ * fVar239;
  auVar46._28_4_ = auVar97._28_4_ + auVar25._28_4_;
  auVar286 = vfnmadd231ps_fma(auVar46,auVar29,auVar98);
  auVar24 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
  auVar97 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
  auVar25 = vminps_avx(ZEXT1632(auVar89),ZEXT1632(auVar32));
  auVar25 = vminps_avx(auVar24,auVar25);
  auVar24 = vmaxps_avx(ZEXT1632(auVar89),ZEXT1632(auVar32));
  auVar97 = vmaxps_avx(auVar97,auVar24);
  auVar26 = vminps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
  auVar24 = vmaxps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
  auVar17 = vminps_avx(ZEXT1632(auVar106),ZEXT1632(auVar286));
  auVar26 = vminps_avx(auVar26,auVar17);
  auVar26 = vminps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar286));
  auVar24 = vmaxps_avx(auVar24,auVar25);
  auVar24 = vmaxps_avx(auVar97,auVar24);
  auVar58._4_4_ = fStack_204;
  auVar58._0_4_ = local_208;
  auVar58._8_4_ = fStack_200;
  auVar58._12_4_ = fStack_1fc;
  auVar58._16_4_ = fStack_1f8;
  auVar58._20_4_ = fStack_1f4;
  auVar58._24_4_ = fStack_1f0;
  auVar58._28_4_ = fStack_1ec;
  auVar97 = vcmpps_avx(auVar26,auVar58,2);
  auVar56._4_4_ = fStack_224;
  auVar56._0_4_ = local_228;
  auVar56._8_4_ = fStack_220;
  auVar56._12_4_ = fStack_21c;
  auVar56._16_4_ = fStack_218;
  auVar56._20_4_ = fStack_214;
  auVar56._24_4_ = fStack_210;
  auVar56._28_4_ = fStack_20c;
  auVar24 = vcmpps_avx(auVar24,auVar56,5);
  auVar97 = vandps_avx(auVar24,auVar97);
  auVar24 = local_138 & auVar97;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar24 = vsubps_avx(auVar27,_local_3d8);
    auVar25 = vsubps_avx(auVar29,auVar301);
    fVar234 = auVar24._0_4_ + auVar25._0_4_;
    fVar235 = auVar24._4_4_ + auVar25._4_4_;
    fVar236 = auVar24._8_4_ + auVar25._8_4_;
    fVar237 = auVar24._12_4_ + auVar25._12_4_;
    fVar238 = auVar24._16_4_ + auVar25._16_4_;
    fVar239 = auVar24._20_4_ + auVar25._20_4_;
    fVar102 = auVar24._24_4_ + auVar25._24_4_;
    auVar26 = vsubps_avx(auVar28,local_78);
    auVar17 = vsubps_avx(local_3b8,ZEXT1632(auVar294));
    auVar128._0_4_ = auVar26._0_4_ + auVar17._0_4_;
    auVar128._4_4_ = auVar26._4_4_ + auVar17._4_4_;
    auVar128._8_4_ = auVar26._8_4_ + auVar17._8_4_;
    auVar128._12_4_ = auVar26._12_4_ + auVar17._12_4_;
    auVar128._16_4_ = auVar26._16_4_ + auVar17._16_4_;
    auVar128._20_4_ = auVar26._20_4_ + auVar17._20_4_;
    auVar128._24_4_ = auVar26._24_4_ + auVar17._24_4_;
    fVar183 = auVar17._28_4_;
    auVar128._28_4_ = auVar26._28_4_ + fVar183;
    auVar47._4_4_ = fVar149 * fVar235;
    auVar47._0_4_ = fVar101 * fVar234;
    auVar47._8_4_ = fVar185 * fVar236;
    auVar47._12_4_ = fVar148 * fVar237;
    auVar47._16_4_ = fVar238 * 0.0;
    auVar47._20_4_ = fVar239 * 0.0;
    auVar47._24_4_ = fVar102 * 0.0;
    auVar47._28_4_ = auVar29._28_4_;
    auVar77 = vfnmadd231ps_fma(auVar47,auVar128,_local_3d8);
    auVar48._4_4_ = fVar235 * fStack_f4;
    auVar48._0_4_ = fVar234 * local_f8;
    auVar48._8_4_ = fVar236 * fStack_f0;
    auVar48._12_4_ = fVar237 * fStack_ec;
    auVar48._16_4_ = fVar238 * fStack_e8;
    auVar48._20_4_ = fVar239 * fStack_e4;
    auVar48._24_4_ = fVar102 * fStack_e0;
    auVar48._28_4_ = 0;
    auVar15 = vfnmadd213ps_fma(auVar127,auVar128,auVar48);
    auVar49._4_4_ = fVar235 * local_118._4_4_;
    auVar49._0_4_ = fVar234 * local_118._0_4_;
    auVar49._8_4_ = fVar236 * local_118._8_4_;
    auVar49._12_4_ = fVar237 * local_118._12_4_;
    auVar49._16_4_ = fVar238 * local_118._16_4_;
    auVar49._20_4_ = fVar239 * local_118._20_4_;
    auVar49._24_4_ = fVar102 * local_118._24_4_;
    auVar49._28_4_ = 0;
    auVar16 = vfnmadd213ps_fma(local_358,auVar128,auVar49);
    auVar50._4_4_ = (float)local_608._4_4_ * fVar235;
    auVar50._0_4_ = (float)local_608._0_4_ * fVar234;
    auVar50._8_4_ = (float)uStack_600 * fVar236;
    auVar50._12_4_ = uStack_600._4_4_ * fVar237;
    auVar50._16_4_ = (float)uStack_5f8 * fVar238;
    auVar50._20_4_ = uStack_5f8._4_4_ * fVar239;
    auVar50._24_4_ = (float)uStack_5f0 * fVar102;
    auVar50._28_4_ = 0;
    auVar294 = vfnmadd231ps_fma(auVar50,auVar128,auVar27);
    auVar163._0_4_ = fVar129 * fVar234;
    auVar163._4_4_ = fVar145 * fVar235;
    auVar163._8_4_ = fVar146 * fVar236;
    auVar163._12_4_ = fVar147 * fVar237;
    auVar163._16_4_ = fVar238 * 0.0;
    auVar163._20_4_ = fVar239 * 0.0;
    auVar163._24_4_ = fVar102 * 0.0;
    auVar163._28_4_ = 0;
    auVar75 = vfnmadd231ps_fma(auVar163,auVar128,auVar301);
    auVar51._4_4_ = fVar235 * fStack_d4;
    auVar51._0_4_ = fVar234 * local_d8;
    auVar51._8_4_ = fVar236 * fStack_d0;
    auVar51._12_4_ = fVar237 * fStack_cc;
    auVar51._16_4_ = fVar238 * fStack_c8;
    auVar51._20_4_ = fVar239 * fStack_c4;
    auVar51._24_4_ = fVar102 * fStack_c0;
    auVar51._28_4_ = fVar183;
    auVar89 = vfnmadd213ps_fma(local_98,auVar128,auVar51);
    auVar52._4_4_ = fVar235 * local_b8._4_4_;
    auVar52._0_4_ = fVar234 * local_b8._0_4_;
    auVar52._8_4_ = fVar236 * local_b8._8_4_;
    auVar52._12_4_ = fVar237 * local_b8._12_4_;
    auVar52._16_4_ = fVar238 * local_b8._16_4_;
    auVar52._20_4_ = fVar239 * local_b8._20_4_;
    auVar52._24_4_ = fVar102 * local_b8._24_4_;
    auVar52._28_4_ = fVar183;
    auVar32 = vfnmadd213ps_fma(auVar30,auVar128,auVar52);
    auVar53._4_4_ = local_3b8._4_4_ * fVar235;
    auVar53._0_4_ = local_3b8._0_4_ * fVar234;
    auVar53._8_4_ = local_3b8._8_4_ * fVar236;
    auVar53._12_4_ = local_3b8._12_4_ * fVar237;
    auVar53._16_4_ = local_3b8._16_4_ * fVar238;
    auVar53._20_4_ = local_3b8._20_4_ * fVar239;
    auVar53._24_4_ = local_3b8._24_4_ * fVar102;
    auVar53._28_4_ = auVar24._28_4_ + auVar25._28_4_;
    auVar106 = vfnmadd231ps_fma(auVar53,auVar29,auVar128);
    auVar25 = vminps_avx(ZEXT1632(auVar77),ZEXT1632(auVar15));
    auVar24 = vmaxps_avx(ZEXT1632(auVar77),ZEXT1632(auVar15));
    auVar26 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar294));
    auVar26 = vminps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar294));
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar17 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar89));
    auVar25 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar89));
    auVar27 = vminps_avx(ZEXT1632(auVar32),ZEXT1632(auVar106));
    auVar17 = vminps_avx(auVar17,auVar27);
    auVar17 = vminps_avx(auVar26,auVar17);
    auVar26 = vmaxps_avx(ZEXT1632(auVar32),ZEXT1632(auVar106));
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(auVar24,auVar25);
    auVar59._4_4_ = fStack_204;
    auVar59._0_4_ = local_208;
    auVar59._8_4_ = fStack_200;
    auVar59._12_4_ = fStack_1fc;
    auVar59._16_4_ = fStack_1f8;
    auVar59._20_4_ = fStack_1f4;
    auVar59._24_4_ = fStack_1f0;
    auVar59._28_4_ = fStack_1ec;
    auVar24 = vcmpps_avx(auVar17,auVar59,2);
    auVar57._4_4_ = fStack_224;
    auVar57._0_4_ = local_228;
    auVar57._8_4_ = fStack_220;
    auVar57._12_4_ = fStack_21c;
    auVar57._16_4_ = fStack_218;
    auVar57._20_4_ = fStack_214;
    auVar57._24_4_ = fStack_210;
    auVar57._28_4_ = fStack_20c;
    auVar25 = vcmpps_avx(auVar25,auVar57,5);
    auVar24 = vandps_avx(auVar25,auVar24);
    auVar97 = vandps_avx(local_138,auVar97);
    auVar25 = auVar97 & auVar24;
    auVar335 = ZEXT864(0) << 0x20;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0x7f,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar25 >> 0xbf,0) == '\0') &&
        (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f])
    goto LAB_016dd26b;
    auVar97 = vandps_avx(auVar24,auVar97);
    uVar69 = vmovmskps_avx(auVar97);
    if (uVar69 == 0) goto LAB_016dd26b;
    uVar64 = (ulong)uVar70;
    auStack_398[uVar64] = uVar69 & 0xff;
    uVar103 = vmovlps_avx(local_2c8);
    *(undefined8 *)(&uStack_1e8 + uVar64 * 2) = uVar103;
    uVar68 = vmovlps_avx(auVar191);
    auStack_58[uVar64] = uVar68;
    uVar70 = uVar70 + 1;
    goto LAB_016dd26b;
  }
LAB_016dd115:
  auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_016dd26b:
  if (uVar70 == 0) {
    if ((uVar63 & 1) != 0) goto LAB_016de214;
    uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar96._4_4_ = uVar74;
    auVar96._0_4_ = uVar74;
    auVar96._8_4_ = uVar74;
    auVar96._12_4_ = uVar74;
    auVar15 = vcmpps_avx(local_2d8,auVar96,2);
    uVar62 = vmovmskps_avx(auVar15);
    uVar61 = uVar61 & uVar61 + 0xf & uVar62;
    if (uVar61 == 0) goto LAB_016de214;
    goto LAB_016dc02a;
  }
  uVar64 = (ulong)(uVar70 - 1);
  uVar67 = auStack_398[uVar64];
  uVar69 = (&uStack_1e8)[uVar64 * 2];
  fVar101 = afStack_1e4[uVar64 * 2];
  iVar31 = 0;
  for (uVar68 = (ulong)uVar67; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    iVar31 = iVar31 + 1;
  }
  uVar67 = uVar67 - 1 & uVar67;
  if (uVar67 == 0) {
    uVar70 = uVar70 - 1;
  }
  auVar192._8_8_ = 0;
  auVar192._0_8_ = auStack_58[uVar64];
  auVar335 = ZEXT1664(auVar192);
  auStack_398[uVar64] = uVar67;
  fVar149 = (float)(iVar31 + 1) * 0.14285715;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * (float)iVar31 * 0.14285715)),ZEXT416(uVar69),
                            ZEXT416((uint)(1.0 - (float)iVar31 * 0.14285715)));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * fVar149)),ZEXT416(uVar69),
                            ZEXT416((uint)(1.0 - fVar149)));
  fVar149 = auVar16._0_4_;
  fVar185 = auVar15._0_4_;
  fVar101 = fVar149 - fVar185;
  if (0.16666667 <= fVar101) {
    auVar15 = vinsertps_avx(auVar15,auVar16,0x10);
    auVar302 = ZEXT1664(auVar15);
    goto LAB_016dccda;
  }
  auVar89 = vshufps_avx(auVar192,auVar192,0x50);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar117,auVar89);
  fVar148 = auVar89._0_4_;
  auVar176._0_4_ = fVar148 * fVar165;
  fVar129 = auVar89._4_4_;
  auVar176._4_4_ = fVar129 * fVar182;
  fVar145 = auVar89._8_4_;
  auVar176._8_4_ = fVar145 * fVar165;
  fVar146 = auVar89._12_4_;
  auVar176._12_4_ = fVar146 * fVar182;
  auVar193._0_4_ = fVar184 * fVar148;
  auVar193._4_4_ = fVar202 * fVar129;
  auVar193._8_4_ = fVar184 * fVar145;
  auVar193._12_4_ = fVar202 * fVar146;
  auVar217._0_4_ = fVar255 * fVar148;
  auVar217._4_4_ = fVar268 * fVar129;
  auVar217._8_4_ = fVar255 * fVar145;
  auVar217._12_4_ = fVar268 * fVar146;
  auVar86._0_4_ = fVar280 * fVar148;
  auVar86._4_4_ = fVar291 * fVar129;
  auVar86._8_4_ = fVar280 * fVar145;
  auVar86._12_4_ = fVar291 * fVar146;
  auVar89 = vfmadd231ps_fma(auVar176,auVar32,auVar247);
  auVar77 = vfmadd231ps_fma(auVar193,auVar32,auVar271);
  auVar294 = vfmadd231ps_fma(auVar217,auVar32,auVar310);
  auVar32 = vfmadd231ps_fma(auVar86,auVar32,auVar322);
  auVar164._16_16_ = auVar89;
  auVar164._0_16_ = auVar89;
  auVar181._16_16_ = auVar77;
  auVar181._0_16_ = auVar77;
  auVar201._16_16_ = auVar294;
  auVar201._0_16_ = auVar294;
  auVar233._4_4_ = fVar185;
  auVar233._0_4_ = fVar185;
  auVar233._8_4_ = fVar185;
  auVar233._12_4_ = fVar185;
  auVar233._20_4_ = fVar149;
  auVar233._16_4_ = fVar149;
  auVar233._24_4_ = fVar149;
  auVar233._28_4_ = fVar149;
  auVar97 = vsubps_avx(auVar181,auVar164);
  auVar77 = vfmadd213ps_fma(auVar97,auVar233,auVar164);
  auVar97 = vsubps_avx(auVar201,auVar181);
  auVar75 = vfmadd213ps_fma(auVar97,auVar233,auVar181);
  auVar89 = vsubps_avx(auVar32,auVar294);
  auVar99._16_16_ = auVar89;
  auVar99._0_16_ = auVar89;
  auVar89 = vfmadd213ps_fma(auVar99,auVar233,auVar201);
  auVar97 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar77));
  auVar32 = vfmadd213ps_fma(auVar97,auVar233,ZEXT1632(auVar77));
  auVar97 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar75));
  auVar89 = vfmadd213ps_fma(auVar97,auVar233,ZEXT1632(auVar75));
  auVar97 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar32));
  auVar130 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar97,auVar233);
  fVar148 = fVar101 * 0.33333334;
  auVar228._0_8_ =
       CONCAT44(auVar130._4_4_ + fVar148 * auVar97._4_4_ * 3.0,
                auVar130._0_4_ + fVar148 * auVar97._0_4_ * 3.0);
  auVar228._8_4_ = auVar130._8_4_ + fVar148 * auVar97._8_4_ * 3.0;
  auVar228._12_4_ = auVar130._12_4_ + fVar148 * auVar97._12_4_ * 3.0;
  auVar32 = vshufpd_avx(auVar130,auVar130,3);
  auVar77 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
  auVar89 = vsubps_avx(auVar32,auVar130);
  auVar294 = vsubps_avx(auVar77,(undefined1  [16])0x0);
  auVar87._0_4_ = auVar89._0_4_ + auVar294._0_4_;
  auVar87._4_4_ = auVar89._4_4_ + auVar294._4_4_;
  auVar87._8_4_ = auVar89._8_4_ + auVar294._8_4_;
  auVar87._12_4_ = auVar89._12_4_ + auVar294._12_4_;
  auVar89 = vshufps_avx(auVar130,auVar130,0xb1);
  auVar294 = vshufps_avx(auVar228,auVar228,0xb1);
  auVar323._4_4_ = auVar87._0_4_;
  auVar323._0_4_ = auVar87._0_4_;
  auVar323._8_4_ = auVar87._0_4_;
  auVar323._12_4_ = auVar87._0_4_;
  auVar75 = vshufps_avx(auVar87,auVar87,0x55);
  fVar129 = auVar75._0_4_;
  auVar88._0_4_ = fVar129 * auVar89._0_4_;
  fVar145 = auVar75._4_4_;
  auVar88._4_4_ = fVar145 * auVar89._4_4_;
  fVar146 = auVar75._8_4_;
  auVar88._8_4_ = fVar146 * auVar89._8_4_;
  fVar147 = auVar75._12_4_;
  auVar88._12_4_ = fVar147 * auVar89._12_4_;
  auVar194._0_4_ = fVar129 * auVar294._0_4_;
  auVar194._4_4_ = fVar145 * auVar294._4_4_;
  auVar194._8_4_ = fVar146 * auVar294._8_4_;
  auVar194._12_4_ = fVar147 * auVar294._12_4_;
  auVar106 = vfmadd231ps_fma(auVar88,auVar323,auVar130);
  local_3b8._0_16_ = auVar228;
  auVar286 = vfmadd231ps_fma(auVar194,auVar323,auVar228);
  auVar294 = vshufps_avx(auVar106,auVar106,0xe8);
  auVar75 = vshufps_avx(auVar286,auVar286,0xe8);
  auVar89 = vcmpps_avx(auVar294,auVar75,1);
  uVar69 = vextractps_avx(auVar89,0);
  auVar131 = auVar286;
  if ((uVar69 & 1) == 0) {
    auVar131 = auVar106;
  }
  auVar156._0_4_ = fVar148 * auVar97._16_4_ * 3.0;
  auVar156._4_4_ = fVar148 * auVar97._20_4_ * 3.0;
  auVar156._8_4_ = fVar148 * auVar97._24_4_ * 3.0;
  auVar156._12_4_ = fVar148 * 0.0;
  auVar203 = vsubps_avx((undefined1  [16])0x0,auVar156);
  auVar157 = vshufps_avx(auVar203,auVar203,0xb1);
  auVar166 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
  auVar229._0_4_ = fVar129 * auVar157._0_4_;
  auVar229._4_4_ = fVar145 * auVar157._4_4_;
  auVar229._8_4_ = fVar146 * auVar157._8_4_;
  auVar229._12_4_ = fVar147 * auVar157._12_4_;
  auVar248._0_4_ = auVar166._0_4_ * fVar129;
  auVar248._4_4_ = auVar166._4_4_ * fVar145;
  auVar248._8_4_ = auVar166._8_4_ * fVar146;
  auVar248._12_4_ = auVar166._12_4_ * fVar147;
  _local_3d8 = auVar203;
  auVar204 = vfmadd231ps_fma(auVar229,auVar323,auVar203);
  auVar221 = vfmadd231ps_fma(auVar248,(undefined1  [16])0x0,auVar323);
  auVar166 = vshufps_avx(auVar204,auVar204,0xe8);
  auVar191 = vshufps_avx(auVar221,auVar221,0xe8);
  auVar157 = vcmpps_avx(auVar166,auVar191,1);
  uVar69 = vextractps_avx(auVar157,0);
  auVar222 = auVar221;
  if ((uVar69 & 1) == 0) {
    auVar222 = auVar204;
  }
  auVar131 = vmaxss_avx(auVar222,auVar131);
  auVar294 = vminps_avx(auVar294,auVar75);
  auVar75 = vminps_avx(auVar166,auVar191);
  auVar75 = vminps_avx(auVar294,auVar75);
  auVar89 = vshufps_avx(auVar89,auVar89,0x55);
  auVar89 = vblendps_avx(auVar89,auVar157,2);
  auVar157 = vpslld_avx(auVar89,0x1f);
  auVar89 = vshufpd_avx(auVar286,auVar286,1);
  auVar89 = vinsertps_avx(auVar89,auVar221,0x9c);
  auVar294 = vshufpd_avx(auVar106,auVar106,1);
  auVar294 = vinsertps_avx(auVar294,auVar204,0x9c);
  auVar89 = vblendvps_avx(auVar294,auVar89,auVar157);
  auVar294 = vmovshdup_avx(auVar89);
  auVar89 = vmaxss_avx(auVar294,auVar89);
  fVar146 = auVar75._0_4_;
  auVar294 = vmovshdup_avx(auVar75);
  fVar145 = auVar89._0_4_;
  fVar148 = auVar294._0_4_;
  fVar129 = auVar131._0_4_;
  if (((0.0001 <= fVar146) || (fVar145 <= -0.0001)) && (0.0001 <= fVar148 || fVar145 <= -0.0001)) {
    auVar294 = vcmpps_avx(auVar294,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar106 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar294 = vandps_avx(auVar106,auVar294);
    if (fVar129 <= -0.0001 || (auVar294 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_016dd115;
  }
  auVar106 = vcmpps_avx(auVar75,_DAT_01f7aa10,1);
  auVar286 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar294 = vcmpss_avx(auVar131,ZEXT816(0) << 0x20,1);
  auVar136._8_4_ = 0xbf800000;
  auVar136._0_8_ = 0xbf800000bf800000;
  auVar136._12_4_ = 0xbf800000;
  auVar294 = vblendvps_avx(auVar117,auVar136,auVar294);
  auVar106 = vblendvps_avx(auVar117,auVar136,auVar106);
  fVar183 = auVar106._0_4_;
  fVar147 = auVar294._0_4_;
  auVar294 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar183 == fVar147) && (!NAN(fVar183) && !NAN(fVar147))) {
    auVar294 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar183 == fVar147) && (!NAN(fVar183) && !NAN(fVar147))) {
    auVar286 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar106 = vmovshdup_avx(auVar106);
  fVar234 = auVar106._0_4_;
  if ((fVar183 != fVar234) || (NAN(fVar183) || NAN(fVar234))) {
    if ((fVar148 != fVar146) || (NAN(fVar148) || NAN(fVar146))) {
      auVar158._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar158._8_4_ = auVar75._8_4_ ^ 0x80000000;
      auVar158._12_4_ = auVar75._12_4_ ^ 0x80000000;
      auVar159._0_4_ = -fVar146 / (fVar148 - fVar146);
      auVar159._4_12_ = auVar158._4_12_;
      auVar54._12_4_ = 0;
      auVar54._0_12_ = ZEXT812(0);
      auVar335 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar54 << 0x20,auVar159);
      auVar106 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      auVar335 = ZEXT1264(ZEXT812(0)) << 0x20;
      if ((fVar146 != 0.0) || (auVar106 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar146))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar106 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar294 = vminss_avx(auVar294,auVar75);
    auVar286 = vmaxss_avx(auVar106,auVar286);
  }
  else {
    auVar335 = ZEXT1264(ZEXT812(0)) << 0x20;
  }
  auVar75 = auVar335._0_16_;
  auVar89 = vcmpss_avx(auVar89,auVar75,1);
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar89 = vblendvps_avx(auVar117,auVar137,auVar89);
  fVar148 = auVar89._0_4_;
  if ((fVar147 != fVar148) || (NAN(fVar147) || NAN(fVar148))) {
    if ((fVar145 != fVar129) || (NAN(fVar145) || NAN(fVar129))) {
      auVar90._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
      auVar90._8_4_ = auVar131._8_4_ ^ 0x80000000;
      auVar90._12_4_ = auVar131._12_4_ ^ 0x80000000;
      auVar160._0_4_ = -fVar129 / (fVar145 - fVar129);
      auVar160._4_12_ = auVar90._4_12_;
      auVar89 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar160._0_4_)),auVar75,auVar160);
      auVar106 = auVar89;
    }
    else {
      auVar89 = ZEXT816(0) << 0x20;
      if ((fVar129 != 0.0) || (auVar106 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar129))) {
        auVar89 = SUB6416(ZEXT464(0x7f800000),0);
        auVar106 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar294 = vminss_avx(auVar294,auVar89);
    auVar286 = vmaxss_avx(auVar106,auVar286);
  }
  auVar89 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar234 != fVar148) || (NAN(fVar234) || NAN(fVar148))) {
    auVar294 = vminss_avx(auVar294,auVar89);
    auVar286 = vmaxss_avx(auVar89,auVar286);
  }
  auVar294 = vmaxss_avx(auVar75,auVar294);
  auVar106 = vminss_avx(auVar286,auVar89);
  if (auVar294._0_4_ <= auVar106._0_4_) {
    auVar294 = vmaxss_avx(auVar75,ZEXT416((uint)(auVar294._0_4_ + -0.1)));
    auVar89 = vminss_avx(ZEXT416((uint)(auVar106._0_4_ + 0.1)),auVar89);
    auVar177._0_8_ = auVar130._0_8_;
    auVar177._8_8_ = auVar177._0_8_;
    auVar260._8_8_ = auVar228._0_8_;
    auVar260._0_8_ = auVar228._0_8_;
    auVar272._8_8_ = auVar203._0_8_;
    auVar272._0_8_ = auVar203._0_8_;
    auVar75 = vshufpd_avx(auVar228,auVar228,3);
    auVar106 = vshufpd_avx(auVar203,auVar203,3);
    auVar286 = vshufps_avx(auVar294,auVar89,0);
    auVar130 = vsubps_avx(auVar117,auVar286);
    local_488._0_4_ = auVar32._0_4_;
    local_488._4_4_ = auVar32._4_4_;
    fStack_480 = auVar32._8_4_;
    fStack_47c = auVar32._12_4_;
    fVar148 = auVar286._0_4_;
    auVar91._0_4_ = fVar148 * (float)local_488._0_4_;
    fVar129 = auVar286._4_4_;
    auVar91._4_4_ = fVar129 * (float)local_488._4_4_;
    fVar145 = auVar286._8_4_;
    auVar91._8_4_ = fVar145 * fStack_480;
    fVar146 = auVar286._12_4_;
    auVar91._12_4_ = fVar146 * fStack_47c;
    auVar218._0_4_ = fVar148 * auVar75._0_4_;
    auVar218._4_4_ = fVar129 * auVar75._4_4_;
    auVar218._8_4_ = fVar145 * auVar75._8_4_;
    auVar218._12_4_ = fVar146 * auVar75._12_4_;
    auVar230._0_4_ = fVar148 * auVar106._0_4_;
    auVar230._4_4_ = fVar129 * auVar106._4_4_;
    auVar230._8_4_ = fVar145 * auVar106._8_4_;
    auVar230._12_4_ = fVar146 * auVar106._12_4_;
    local_518 = auVar77._0_4_;
    fStack_514 = auVar77._4_4_;
    fStack_510 = auVar77._8_4_;
    fStack_50c = auVar77._12_4_;
    auVar249._0_4_ = fVar148 * local_518;
    auVar249._4_4_ = fVar129 * fStack_514;
    auVar249._8_4_ = fVar145 * fStack_510;
    auVar249._12_4_ = fVar146 * fStack_50c;
    auVar75 = vfmadd231ps_fma(auVar91,auVar130,auVar177);
    auVar106 = vfmadd231ps_fma(auVar218,auVar130,auVar260);
    auVar286 = vfmadd231ps_fma(auVar230,auVar130,auVar272);
    auVar130 = vfmadd231ps_fma(auVar249,auVar130,ZEXT816(0));
    auVar32 = vmovshdup_avx(auVar192);
    auVar203 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar294._0_4_)),auVar192,
                               ZEXT416((uint)(1.0 - auVar294._0_4_)));
    auVar204 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar89._0_4_)),auVar192,
                               ZEXT416((uint)(1.0 - auVar89._0_4_)));
    fVar148 = 1.0 / fVar101;
    auVar89 = vsubps_avx(auVar106,auVar75);
    auVar261._0_4_ = auVar89._0_4_ * 3.0;
    auVar261._4_4_ = auVar89._4_4_ * 3.0;
    auVar261._8_4_ = auVar89._8_4_ * 3.0;
    auVar261._12_4_ = auVar89._12_4_ * 3.0;
    auVar89 = vsubps_avx(auVar286,auVar106);
    auVar273._0_4_ = auVar89._0_4_ * 3.0;
    auVar273._4_4_ = auVar89._4_4_ * 3.0;
    auVar273._8_4_ = auVar89._8_4_ * 3.0;
    auVar273._12_4_ = auVar89._12_4_ * 3.0;
    auVar89 = vsubps_avx(auVar130,auVar286);
    auVar287._0_4_ = auVar89._0_4_ * 3.0;
    auVar287._4_4_ = auVar89._4_4_ * 3.0;
    auVar287._8_4_ = auVar89._8_4_ * 3.0;
    auVar287._12_4_ = auVar89._12_4_ * 3.0;
    auVar32 = vminps_avx(auVar273,auVar287);
    auVar89 = vmaxps_avx(auVar273,auVar287);
    auVar32 = vminps_avx(auVar261,auVar32);
    auVar89 = vmaxps_avx(auVar261,auVar89);
    auVar77 = vshufpd_avx(auVar32,auVar32,3);
    auVar294 = vshufpd_avx(auVar89,auVar89,3);
    auVar32 = vminps_avx(auVar32,auVar77);
    auVar89 = vmaxps_avx(auVar89,auVar294);
    auVar274._0_4_ = auVar32._0_4_ * fVar148;
    auVar274._4_4_ = auVar32._4_4_ * fVar148;
    auVar274._8_4_ = auVar32._8_4_ * fVar148;
    auVar274._12_4_ = auVar32._12_4_ * fVar148;
    auVar262._0_4_ = auVar89._0_4_ * fVar148;
    auVar262._4_4_ = auVar89._4_4_ * fVar148;
    auVar262._8_4_ = auVar89._8_4_ * fVar148;
    auVar262._12_4_ = auVar89._12_4_ * fVar148;
    fVar148 = 1.0 / (auVar204._0_4_ - auVar203._0_4_);
    auVar89 = vshufpd_avx(auVar75,auVar75,3);
    auVar32 = vshufpd_avx(auVar106,auVar106,3);
    auVar77 = vshufpd_avx(auVar286,auVar286,3);
    auVar294 = vshufpd_avx(auVar130,auVar130,3);
    auVar89 = vsubps_avx(auVar89,auVar75);
    auVar75 = vsubps_avx(auVar32,auVar106);
    auVar106 = vsubps_avx(auVar77,auVar286);
    auVar294 = vsubps_avx(auVar294,auVar130);
    auVar32 = vminps_avx(auVar89,auVar75);
    auVar89 = vmaxps_avx(auVar89,auVar75);
    auVar77 = vminps_avx(auVar106,auVar294);
    auVar77 = vminps_avx(auVar32,auVar77);
    auVar32 = vmaxps_avx(auVar106,auVar294);
    auVar89 = vmaxps_avx(auVar89,auVar32);
    auVar311._0_4_ = fVar148 * auVar77._0_4_;
    auVar311._4_4_ = fVar148 * auVar77._4_4_;
    auVar311._8_4_ = fVar148 * auVar77._8_4_;
    auVar311._12_4_ = fVar148 * auVar77._12_4_;
    auVar295._0_4_ = fVar148 * auVar89._0_4_;
    auVar295._4_4_ = fVar148 * auVar89._4_4_;
    auVar295._8_4_ = fVar148 * auVar89._8_4_;
    auVar295._12_4_ = fVar148 * auVar89._12_4_;
    auVar294 = vinsertps_avx(auVar15,auVar203,0x10);
    auVar75 = vinsertps_avx(auVar16,auVar204,0x10);
    auVar288._0_4_ = (auVar294._0_4_ + auVar75._0_4_) * 0.5;
    auVar288._4_4_ = (auVar294._4_4_ + auVar75._4_4_) * 0.5;
    auVar288._8_4_ = (auVar294._8_4_ + auVar75._8_4_) * 0.5;
    auVar288._12_4_ = (auVar294._12_4_ + auVar75._12_4_) * 0.5;
    auVar92._4_4_ = auVar288._0_4_;
    auVar92._0_4_ = auVar288._0_4_;
    auVar92._8_4_ = auVar288._0_4_;
    auVar92._12_4_ = auVar288._0_4_;
    auVar89 = vfmadd213ps_fma(local_238,auVar92,auVar18);
    auVar32 = vfmadd213ps_fma(local_248,auVar92,auVar19);
    auVar77 = vfmadd213ps_fma(local_258,auVar92,auVar170);
    auVar16 = vsubps_avx(auVar32,auVar89);
    auVar89 = vfmadd213ps_fma(auVar16,auVar92,auVar89);
    auVar16 = vsubps_avx(auVar77,auVar32);
    auVar16 = vfmadd213ps_fma(auVar16,auVar92,auVar32);
    auVar16 = vsubps_avx(auVar16,auVar89);
    auVar89 = vfmadd231ps_fma(auVar89,auVar16,auVar92);
    auVar93._0_8_ = CONCAT44(auVar16._4_4_ * 3.0,auVar16._0_4_ * 3.0);
    auVar93._8_4_ = auVar16._8_4_ * 3.0;
    auVar93._12_4_ = auVar16._12_4_ * 3.0;
    auVar324._8_8_ = auVar89._0_8_;
    auVar324._0_8_ = auVar89._0_8_;
    auVar16 = vshufpd_avx(auVar89,auVar89,3);
    auVar89 = vshufps_avx(auVar288,auVar288,0x55);
    auVar286 = vsubps_avx(auVar16,auVar324);
    auVar131 = vfmadd231ps_fma(auVar324,auVar89,auVar286);
    auVar331._8_8_ = auVar93._0_8_;
    auVar331._0_8_ = auVar93._0_8_;
    auVar16 = vshufpd_avx(auVar93,auVar93,3);
    auVar16 = vsubps_avx(auVar16,auVar331);
    auVar130 = vfmadd213ps_fma(auVar16,auVar89,auVar331);
    auVar89 = vmovshdup_avx(auVar130);
    auVar332._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
    auVar332._8_4_ = auVar89._8_4_ ^ 0x80000000;
    auVar332._12_4_ = auVar89._12_4_ ^ 0x80000000;
    auVar32 = vmovshdup_avx(auVar286);
    auVar16 = vunpcklps_avx(auVar32,auVar332);
    auVar77 = vshufps_avx(auVar16,auVar332,4);
    auVar106 = vshufps_avx(auVar288,auVar288,0x54);
    auVar161._0_8_ = auVar286._0_8_ ^ 0x8000000080000000;
    auVar161._8_4_ = auVar286._8_4_ ^ 0x80000000;
    auVar161._12_4_ = auVar286._12_4_ ^ 0x80000000;
    auVar16 = vmovlhps_avx(auVar161,auVar130);
    auVar16 = vshufps_avx(auVar16,auVar130,8);
    auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar286._0_4_ * auVar89._0_4_)),auVar32,auVar130);
    uVar74 = auVar89._0_4_;
    auVar94._4_4_ = uVar74;
    auVar94._0_4_ = uVar74;
    auVar94._8_4_ = uVar74;
    auVar94._12_4_ = uVar74;
    auVar89 = vdivps_avx(auVar77,auVar94);
    auVar32 = vdivps_avx(auVar16,auVar94);
    fVar145 = auVar131._0_4_;
    fVar148 = auVar89._0_4_;
    auVar16 = vshufps_avx(auVar131,auVar131,0x55);
    fVar129 = auVar32._0_4_;
    auVar95._0_4_ = fVar145 * fVar148 + auVar16._0_4_ * fVar129;
    auVar95._4_4_ = fVar145 * auVar89._4_4_ + auVar16._4_4_ * auVar32._4_4_;
    auVar95._8_4_ = fVar145 * auVar89._8_4_ + auVar16._8_4_ * auVar32._8_4_;
    auVar95._12_4_ = fVar145 * auVar89._12_4_ + auVar16._12_4_ * auVar32._12_4_;
    auVar191 = vsubps_avx(auVar106,auVar95);
    auVar106 = vmovshdup_avx(auVar89);
    auVar16 = vinsertps_avx(auVar274,auVar311,0x1c);
    auVar195._0_4_ = auVar106._0_4_ * auVar16._0_4_;
    auVar195._4_4_ = auVar106._4_4_ * auVar16._4_4_;
    auVar195._8_4_ = auVar106._8_4_ * auVar16._8_4_;
    auVar195._12_4_ = auVar106._12_4_ * auVar16._12_4_;
    auVar77 = vinsertps_avx(auVar262,auVar295,0x1c);
    auVar118._0_4_ = auVar77._0_4_ * auVar106._0_4_;
    auVar118._4_4_ = auVar77._4_4_ * auVar106._4_4_;
    auVar118._8_4_ = auVar77._8_4_ * auVar106._8_4_;
    auVar118._12_4_ = auVar77._12_4_ * auVar106._12_4_;
    auVar131 = vminps_avx(auVar195,auVar118);
    auVar130 = vmaxps_avx(auVar118,auVar195);
    auVar106 = vinsertps_avx(auVar311,auVar274,0x4c);
    auVar157 = vmovshdup_avx(auVar32);
    auVar286 = vinsertps_avx(auVar295,auVar262,0x4c);
    auVar296._0_4_ = auVar157._0_4_ * auVar106._0_4_;
    auVar296._4_4_ = auVar157._4_4_ * auVar106._4_4_;
    auVar296._8_4_ = auVar157._8_4_ * auVar106._8_4_;
    auVar296._12_4_ = auVar157._12_4_ * auVar106._12_4_;
    auVar275._0_4_ = auVar157._0_4_ * auVar286._0_4_;
    auVar275._4_4_ = auVar157._4_4_ * auVar286._4_4_;
    auVar275._8_4_ = auVar157._8_4_ * auVar286._8_4_;
    auVar275._12_4_ = auVar157._12_4_ * auVar286._12_4_;
    auVar157 = vminps_avx(auVar296,auVar275);
    auVar312._0_4_ = auVar131._0_4_ + auVar157._0_4_;
    auVar312._4_4_ = auVar131._4_4_ + auVar157._4_4_;
    auVar312._8_4_ = auVar131._8_4_ + auVar157._8_4_;
    auVar312._12_4_ = auVar131._12_4_ + auVar157._12_4_;
    auVar131 = vmaxps_avx(auVar275,auVar296);
    auVar119._0_4_ = auVar131._0_4_ + auVar130._0_4_;
    auVar119._4_4_ = auVar131._4_4_ + auVar130._4_4_;
    auVar119._8_4_ = auVar131._8_4_ + auVar130._8_4_;
    auVar119._12_4_ = auVar131._12_4_ + auVar130._12_4_;
    auVar276._8_8_ = 0x3f80000000000000;
    auVar276._0_8_ = 0x3f80000000000000;
    auVar130 = vsubps_avx(auVar276,auVar119);
    auVar131 = vsubps_avx(auVar276,auVar312);
    auVar157 = vsubps_avx(auVar294,auVar288);
    auVar166 = vsubps_avx(auVar75,auVar288);
    auVar138._0_4_ = fVar148 * auVar16._0_4_;
    auVar138._4_4_ = fVar148 * auVar16._4_4_;
    auVar138._8_4_ = fVar148 * auVar16._8_4_;
    auVar138._12_4_ = fVar148 * auVar16._12_4_;
    auVar313._0_4_ = fVar148 * auVar77._0_4_;
    auVar313._4_4_ = fVar148 * auVar77._4_4_;
    auVar313._8_4_ = fVar148 * auVar77._8_4_;
    auVar313._12_4_ = fVar148 * auVar77._12_4_;
    auVar77 = vminps_avx(auVar138,auVar313);
    auVar16 = vmaxps_avx(auVar313,auVar138);
    auVar196._0_4_ = fVar129 * auVar106._0_4_;
    auVar196._4_4_ = fVar129 * auVar106._4_4_;
    auVar196._8_4_ = fVar129 * auVar106._8_4_;
    auVar196._12_4_ = fVar129 * auVar106._12_4_;
    auVar263._0_4_ = fVar129 * auVar286._0_4_;
    auVar263._4_4_ = fVar129 * auVar286._4_4_;
    auVar263._8_4_ = fVar129 * auVar286._8_4_;
    auVar263._12_4_ = fVar129 * auVar286._12_4_;
    auVar106 = vminps_avx(auVar196,auVar263);
    auVar314._0_4_ = auVar77._0_4_ + auVar106._0_4_;
    auVar314._4_4_ = auVar77._4_4_ + auVar106._4_4_;
    auVar314._8_4_ = auVar77._8_4_ + auVar106._8_4_;
    auVar314._12_4_ = auVar77._12_4_ + auVar106._12_4_;
    fVar234 = auVar157._0_4_;
    auVar325._0_4_ = fVar234 * auVar130._0_4_;
    fVar235 = auVar157._4_4_;
    auVar325._4_4_ = fVar235 * auVar130._4_4_;
    fVar236 = auVar157._8_4_;
    auVar325._8_4_ = fVar236 * auVar130._8_4_;
    fVar237 = auVar157._12_4_;
    auVar325._12_4_ = fVar237 * auVar130._12_4_;
    auVar77 = vmaxps_avx(auVar263,auVar196);
    auVar264._0_4_ = fVar234 * auVar131._0_4_;
    auVar264._4_4_ = fVar235 * auVar131._4_4_;
    auVar264._8_4_ = fVar236 * auVar131._8_4_;
    auVar264._12_4_ = fVar237 * auVar131._12_4_;
    fVar145 = auVar166._0_4_;
    auVar120._0_4_ = fVar145 * auVar130._0_4_;
    fVar146 = auVar166._4_4_;
    auVar120._4_4_ = fVar146 * auVar130._4_4_;
    fVar147 = auVar166._8_4_;
    auVar120._8_4_ = fVar147 * auVar130._8_4_;
    fVar183 = auVar166._12_4_;
    auVar120._12_4_ = fVar183 * auVar130._12_4_;
    auVar277._0_4_ = fVar145 * auVar131._0_4_;
    auVar277._4_4_ = fVar146 * auVar131._4_4_;
    auVar277._8_4_ = fVar147 * auVar131._8_4_;
    auVar277._12_4_ = fVar183 * auVar131._12_4_;
    auVar139._0_4_ = auVar16._0_4_ + auVar77._0_4_;
    auVar139._4_4_ = auVar16._4_4_ + auVar77._4_4_;
    auVar139._8_4_ = auVar16._8_4_ + auVar77._8_4_;
    auVar139._12_4_ = auVar16._12_4_ + auVar77._12_4_;
    auVar197._8_8_ = 0x3f800000;
    auVar197._0_8_ = 0x3f800000;
    auVar16 = vsubps_avx(auVar197,auVar139);
    auVar77 = vsubps_avx(auVar197,auVar314);
    auVar315._0_4_ = fVar234 * auVar16._0_4_;
    auVar315._4_4_ = fVar235 * auVar16._4_4_;
    auVar315._8_4_ = fVar236 * auVar16._8_4_;
    auVar315._12_4_ = fVar237 * auVar16._12_4_;
    auVar297._0_4_ = fVar234 * auVar77._0_4_;
    auVar297._4_4_ = fVar235 * auVar77._4_4_;
    auVar297._8_4_ = fVar236 * auVar77._8_4_;
    auVar297._12_4_ = fVar237 * auVar77._12_4_;
    auVar140._0_4_ = fVar145 * auVar16._0_4_;
    auVar140._4_4_ = fVar146 * auVar16._4_4_;
    auVar140._8_4_ = fVar147 * auVar16._8_4_;
    auVar140._12_4_ = fVar183 * auVar16._12_4_;
    auVar198._0_4_ = fVar145 * auVar77._0_4_;
    auVar198._4_4_ = fVar146 * auVar77._4_4_;
    auVar198._8_4_ = fVar147 * auVar77._8_4_;
    auVar198._12_4_ = fVar183 * auVar77._12_4_;
    auVar16 = vminps_avx(auVar315,auVar297);
    auVar77 = vminps_avx(auVar140,auVar198);
    auVar16 = vminps_avx(auVar16,auVar77);
    auVar77 = vmaxps_avx(auVar297,auVar315);
    auVar106 = vmaxps_avx(auVar198,auVar140);
    auVar286 = vminps_avx(auVar325,auVar264);
    auVar130 = vminps_avx(auVar120,auVar277);
    auVar286 = vminps_avx(auVar286,auVar130);
    auVar16 = vhaddps_avx(auVar16,auVar286);
    auVar77 = vmaxps_avx(auVar106,auVar77);
    auVar106 = vmaxps_avx(auVar264,auVar325);
    auVar286 = vmaxps_avx(auVar277,auVar120);
    auVar106 = vmaxps_avx(auVar286,auVar106);
    auVar77 = vhaddps_avx(auVar77,auVar106);
    auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
    auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
    auVar278._0_4_ = auVar191._0_4_ + auVar16._0_4_;
    auVar278._4_4_ = auVar191._4_4_ + auVar16._4_4_;
    auVar278._8_4_ = auVar191._8_4_ + auVar16._8_4_;
    auVar278._12_4_ = auVar191._12_4_ + auVar16._12_4_;
    auVar265._0_4_ = auVar191._0_4_ + auVar77._0_4_;
    auVar265._4_4_ = auVar191._4_4_ + auVar77._4_4_;
    auVar265._8_4_ = auVar191._8_4_ + auVar77._8_4_;
    auVar265._12_4_ = auVar191._12_4_ + auVar77._12_4_;
    auVar16 = vmaxps_avx(auVar294,auVar278);
    auVar77 = vminps_avx(auVar265,auVar75);
    auVar16 = vcmpps_avx(auVar77,auVar16,1);
    auVar16 = vshufps_avx(auVar16,auVar16,0x50);
    if ((auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar16[0xf] < '\0')
    goto LAB_016dd115;
    bVar66 = 0;
    if (auVar278._0_4_ <= fVar185) {
      auVar335 = ZEXT864(0) << 0x40;
    }
    else {
      auVar335 = ZEXT864(0) << 0x20;
      bVar66 = 0;
      if (auVar265._0_4_ < auVar75._0_4_) {
        auVar77 = vmovshdup_avx(auVar278);
        auVar16 = vcmpps_avx(auVar265,auVar75,1);
        bVar66 = auVar16[4] & auVar203._0_4_ < auVar77._0_4_;
      }
    }
    if (((3 < uVar70 || fVar101 < 0.001) | bVar66) != 1) {
      auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)fVar149),0x10);
      auVar302 = ZEXT1664(auVar15);
      auVar15 = vinsertps_avx(auVar203,ZEXT416((uint)auVar204._0_4_),0x10);
      auVar335 = ZEXT1664(auVar15);
      goto LAB_016dccda;
    }
    lVar65 = 200;
    do {
      fVar145 = auVar191._0_4_;
      fVar185 = 1.0 - fVar145;
      fVar101 = fVar185 * fVar185 * fVar185;
      fVar149 = fVar145 * 3.0 * fVar185 * fVar185;
      fVar185 = fVar185 * fVar145 * fVar145 * 3.0;
      auVar178._4_4_ = fVar101;
      auVar178._0_4_ = fVar101;
      auVar178._8_4_ = fVar101;
      auVar178._12_4_ = fVar101;
      auVar141._4_4_ = fVar149;
      auVar141._0_4_ = fVar149;
      auVar141._8_4_ = fVar149;
      auVar141._12_4_ = fVar149;
      auVar121._4_4_ = fVar185;
      auVar121._0_4_ = fVar185;
      auVar121._8_4_ = fVar185;
      auVar121._12_4_ = fVar185;
      fVar145 = fVar145 * fVar145 * fVar145;
      local_618 = auVar20._0_4_;
      fStack_614 = auVar20._4_4_;
      fStack_610 = auVar20._8_4_;
      fStack_60c = auVar20._12_4_;
      auVar199._0_4_ = fVar145 * local_618;
      auVar199._4_4_ = fVar145 * fStack_614;
      auVar199._8_4_ = fVar145 * fStack_610;
      auVar199._12_4_ = fVar145 * fStack_60c;
      auVar15 = vfmadd231ps_fma(auVar199,auVar170,auVar121);
      auVar15 = vfmadd231ps_fma(auVar15,auVar19,auVar141);
      auVar15 = vfmadd231ps_fma(auVar15,auVar18,auVar178);
      auVar122._8_8_ = auVar15._0_8_;
      auVar122._0_8_ = auVar15._0_8_;
      auVar15 = vshufpd_avx(auVar15,auVar15,3);
      auVar16 = vshufps_avx(auVar191,auVar191,0x55);
      auVar15 = vsubps_avx(auVar15,auVar122);
      auVar16 = vfmadd213ps_fma(auVar15,auVar16,auVar122);
      fVar101 = auVar16._0_4_;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar123._0_4_ = fVar148 * fVar101 + fVar129 * auVar15._0_4_;
      auVar123._4_4_ = auVar89._4_4_ * fVar101 + auVar32._4_4_ * auVar15._4_4_;
      auVar123._8_4_ = auVar89._8_4_ * fVar101 + auVar32._8_4_ * auVar15._8_4_;
      auVar123._12_4_ = auVar89._12_4_ * fVar101 + auVar32._12_4_ * auVar15._12_4_;
      auVar191 = vsubps_avx(auVar191,auVar123);
      auVar15 = vandps_avx(auVar328,auVar16);
      auVar16 = vshufps_avx(auVar15,auVar15,0xf5);
      auVar15 = vmaxss_avx(auVar16,auVar15);
      if (auVar15._0_4_ < fVar100) {
        local_198 = auVar191._0_4_;
        if ((0.0 <= local_198) && (local_198 <= 1.0)) {
          auVar15 = vmovshdup_avx(auVar191);
          fVar101 = auVar15._0_4_;
          if ((0.0 <= fVar101) && (fVar101 <= 1.0)) {
            auVar15 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar106 = vinsertps_avx(auVar15,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                     0x28);
            auVar15 = vdpps_avx(auVar106,local_3e8,0x7f);
            auVar16 = vdpps_avx(auVar106,local_3f8,0x7f);
            auVar89 = vdpps_avx(auVar106,local_268,0x7f);
            auVar32 = vdpps_avx(auVar106,local_278,0x7f);
            auVar77 = vdpps_avx(auVar106,local_288,0x7f);
            auVar294 = vdpps_avx(auVar106,local_298,0x7f);
            auVar75 = vdpps_avx(auVar106,local_2a8,0x7f);
            auVar106 = vdpps_avx(auVar106,local_2b8,0x7f);
            fVar149 = 1.0 - fVar101;
            auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar77._0_4_)),
                                      ZEXT416((uint)fVar149),auVar15);
            auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar294._0_4_ * fVar101)),
                                      ZEXT416((uint)fVar149),auVar16);
            auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar101)),
                                      ZEXT416((uint)fVar149),auVar89);
            auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar106._0_4_)),
                                      ZEXT416((uint)fVar149),auVar32);
            fVar148 = 1.0 - local_198;
            fVar101 = fVar148 * local_198 * local_198 * 3.0;
            fVar145 = local_198 * local_198 * local_198;
            auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * fVar145)),
                                      ZEXT416((uint)fVar101),auVar89);
            fVar149 = local_198 * 3.0 * fVar148 * fVar148;
            auVar16 = vfmadd231ss_fma(auVar89,ZEXT416((uint)fVar149),auVar16);
            fVar185 = fVar148 * fVar148 * fVar148;
            auVar15 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar185),auVar15);
            fVar129 = auVar15._0_4_;
            if ((fVar73 <= fVar129) &&
               (fVar146 = *(float *)(ray + k * 4 + 0x80), fVar129 <= fVar146)) {
              pGVar8 = (context->scene->geometries).items[uVar62].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar72 = false;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar72 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_188 = vshufps_avx(auVar191,auVar191,0x55);
                auVar250._8_4_ = 0x3f800000;
                auVar250._0_8_ = 0x3f8000003f800000;
                auVar250._12_4_ = 0x3f800000;
                auVar15 = vsubps_avx(auVar250,local_188);
                fVar147 = local_188._0_4_;
                auVar266._0_4_ = fVar147 * (float)local_438._0_4_;
                fVar183 = local_188._4_4_;
                auVar266._4_4_ = fVar183 * (float)local_438._4_4_;
                fVar234 = local_188._8_4_;
                auVar266._8_4_ = fVar234 * fStack_430;
                fVar235 = local_188._12_4_;
                auVar266._12_4_ = fVar235 * fStack_42c;
                local_4d8 = auVar21._0_4_;
                fStack_4d4 = auVar21._4_4_;
                fStack_4d0 = auVar21._8_4_;
                fStack_4cc = auVar21._12_4_;
                auVar279._0_4_ = fVar147 * local_4d8;
                auVar279._4_4_ = fVar183 * fStack_4d4;
                auVar279._8_4_ = fVar234 * fStack_4d0;
                auVar279._12_4_ = fVar235 * fStack_4cc;
                auVar289._0_4_ = fVar147 * (float)local_448._0_4_;
                auVar289._4_4_ = fVar183 * (float)local_448._4_4_;
                auVar289._8_4_ = fVar234 * fStack_440;
                auVar289._12_4_ = fVar235 * fStack_43c;
                local_4e8 = auVar22._0_4_;
                fStack_4e4 = auVar22._4_4_;
                fStack_4e0 = auVar22._8_4_;
                fStack_4dc = auVar22._12_4_;
                auVar298._0_4_ = fVar147 * local_4e8;
                auVar298._4_4_ = fVar183 * fStack_4e4;
                auVar298._8_4_ = fVar234 * fStack_4e0;
                auVar298._12_4_ = fVar235 * fStack_4dc;
                auVar16 = vfmadd231ps_fma(auVar266,auVar15,local_408);
                auVar89 = vfmadd231ps_fma(auVar279,auVar15,auVar168);
                auVar32 = vfmadd231ps_fma(auVar289,auVar15,local_418);
                auVar77 = vfmadd231ps_fma(auVar298,auVar15,local_428);
                auVar15 = vsubps_avx(auVar89,auVar16);
                auVar16 = vsubps_avx(auVar32,auVar89);
                auVar89 = vsubps_avx(auVar77,auVar32);
                auVar290._0_4_ = auVar16._0_4_ * local_198;
                auVar290._4_4_ = auVar16._4_4_ * local_198;
                auVar290._8_4_ = auVar16._8_4_ * local_198;
                auVar290._12_4_ = auVar16._12_4_ * local_198;
                auVar219._4_4_ = fVar148;
                auVar219._0_4_ = fVar148;
                auVar219._8_4_ = fVar148;
                auVar219._12_4_ = fVar148;
                auVar15 = vfmadd231ps_fma(auVar290,auVar219,auVar15);
                auVar251._0_4_ = auVar89._0_4_ * local_198;
                auVar251._4_4_ = auVar89._4_4_ * local_198;
                auVar251._8_4_ = auVar89._8_4_ * local_198;
                auVar251._12_4_ = auVar89._12_4_ * local_198;
                auVar16 = vfmadd231ps_fma(auVar251,auVar219,auVar16);
                auVar252._0_4_ = auVar16._0_4_ * local_198;
                auVar252._4_4_ = auVar16._4_4_ * local_198;
                auVar252._8_4_ = auVar16._8_4_ * local_198;
                auVar252._12_4_ = auVar16._12_4_ * local_198;
                auVar16 = vfmadd231ps_fma(auVar252,auVar219,auVar15);
                auVar200._0_4_ = fVar145 * (float)local_338._0_4_;
                auVar200._4_4_ = fVar145 * (float)local_338._4_4_;
                auVar200._8_4_ = fVar145 * fStack_330;
                auVar200._12_4_ = fVar145 * fStack_32c;
                auVar142._4_4_ = fVar101;
                auVar142._0_4_ = fVar101;
                auVar142._8_4_ = fVar101;
                auVar142._12_4_ = fVar101;
                auVar15 = vfmadd132ps_fma(auVar142,auVar200,local_328);
                auVar179._4_4_ = fVar149;
                auVar179._0_4_ = fVar149;
                auVar179._8_4_ = fVar149;
                auVar179._12_4_ = fVar149;
                auVar15 = vfmadd132ps_fma(auVar179,auVar15,local_318);
                auVar143._0_4_ = auVar16._0_4_ * 3.0;
                auVar143._4_4_ = auVar16._4_4_ * 3.0;
                auVar143._8_4_ = auVar16._8_4_ * 3.0;
                auVar143._12_4_ = auVar16._12_4_ * 3.0;
                auVar162._4_4_ = fVar185;
                auVar162._0_4_ = fVar185;
                auVar162._8_4_ = fVar185;
                auVar162._12_4_ = fVar185;
                auVar16 = vfmadd132ps_fma(auVar162,auVar15,local_308);
                auVar15 = vshufps_avx(auVar143,auVar143,0xc9);
                auVar180._0_4_ = auVar16._0_4_ * auVar15._0_4_;
                auVar180._4_4_ = auVar16._4_4_ * auVar15._4_4_;
                auVar180._8_4_ = auVar16._8_4_ * auVar15._8_4_;
                auVar180._12_4_ = auVar16._12_4_ * auVar15._12_4_;
                auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
                auVar16 = vfmsub231ps_fma(auVar180,auVar143,auVar15);
                auVar15 = vshufps_avx(auVar16,auVar16,0x55);
                local_1c8[0] = (RTCHitN)auVar15[0];
                local_1c8[1] = (RTCHitN)auVar15[1];
                local_1c8[2] = (RTCHitN)auVar15[2];
                local_1c8[3] = (RTCHitN)auVar15[3];
                local_1c8[4] = (RTCHitN)auVar15[4];
                local_1c8[5] = (RTCHitN)auVar15[5];
                local_1c8[6] = (RTCHitN)auVar15[6];
                local_1c8[7] = (RTCHitN)auVar15[7];
                local_1c8[8] = (RTCHitN)auVar15[8];
                local_1c8[9] = (RTCHitN)auVar15[9];
                local_1c8[10] = (RTCHitN)auVar15[10];
                local_1c8[0xb] = (RTCHitN)auVar15[0xb];
                local_1c8[0xc] = (RTCHitN)auVar15[0xc];
                local_1c8[0xd] = (RTCHitN)auVar15[0xd];
                local_1c8[0xe] = (RTCHitN)auVar15[0xe];
                local_1c8[0xf] = (RTCHitN)auVar15[0xf];
                local_1b8 = vshufps_avx(auVar16,auVar16,0xaa);
                local_1a8 = auVar16._0_4_;
                uStack_1a4 = local_1a8;
                uStack_1a0 = local_1a8;
                uStack_19c = local_1a8;
                fStack_194 = local_198;
                fStack_190 = local_198;
                fStack_18c = local_198;
                local_178 = CONCAT44(uStack_2f4,local_2f8);
                uStack_170 = CONCAT44(uStack_2ec,uStack_2f0);
                local_168._4_4_ = uStack_2e4;
                local_168._0_4_ = local_2e8;
                local_168._8_4_ = uStack_2e0;
                local_168._12_4_ = uStack_2dc;
                vpcmpeqd_avx2(ZEXT1632(local_168),ZEXT1632(local_168));
                uStack_154 = context->user->instID[0];
                local_158 = uStack_154;
                uStack_150 = uStack_154;
                uStack_14c = uStack_154;
                uStack_148 = context->user->instPrimID[0];
                uStack_144 = uStack_148;
                uStack_140 = uStack_148;
                uStack_13c = uStack_148;
                *(float *)(ray + k * 4 + 0x80) = fVar129;
                local_468 = *local_458;
                local_388.valid = (int *)local_468;
                local_388.geometryUserPtr = pGVar8->userPtr;
                local_388.context = context->user;
                local_388.ray = (RTCRayN *)ray;
                local_388.hit = local_1c8;
                local_388.N = 4;
                local_358._0_4_ = (int)uVar63;
                if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar8->occlusionFilterN)(&local_388);
                  uVar63 = (ulong)(uint)local_358._0_4_;
                  auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                if (local_468 == (undefined1  [16])0x0) {
                  auVar15 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar15 = auVar15 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var14)(&local_388);
                    uVar63 = (ulong)(uint)local_358._0_4_;
                    auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar16 = vpcmpeqd_avx(local_468,_DAT_01f7aa10);
                  auVar15 = auVar16 ^ _DAT_01f7ae20;
                  auVar144._8_4_ = 0xff800000;
                  auVar144._0_8_ = 0xff800000ff800000;
                  auVar144._12_4_ = 0xff800000;
                  auVar16 = vblendvps_avx(auVar144,*(undefined1 (*) [16])(local_388.ray + 0x80),
                                          auVar16);
                  *(undefined1 (*) [16])(local_388.ray + 0x80) = auVar16;
                }
                auVar124._8_8_ = 0x100000001;
                auVar124._0_8_ = 0x100000001;
                bVar72 = (auVar124 & auVar15) != (undefined1  [16])0x0;
                if (!bVar72) {
                  *(float *)(ray + k * 4 + 0x80) = fVar146;
                }
              }
              uVar63 = CONCAT71((int7)(uVar63 >> 8),(byte)uVar63 | bVar72);
            }
          }
        }
        break;
      }
      lVar65 = lVar65 + -1;
    } while (lVar65 != 0);
  }
  goto LAB_016dd26b;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }